

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  byte bVar89;
  byte bVar90;
  ulong uVar91;
  uint uVar92;
  uint uVar93;
  ulong uVar94;
  uint uVar95;
  Geometry *pGVar96;
  uint uVar97;
  long lVar98;
  ulong uVar99;
  byte bVar100;
  float fVar101;
  float fVar150;
  float fVar152;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar109 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar102;
  undefined1 auVar110 [16];
  float fVar151;
  float fVar153;
  float fVar155;
  float fVar156;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar154;
  float fVar157;
  float fVar158;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined4 uVar159;
  vint4 bi_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined8 uVar175;
  vint4 bi_1;
  undefined1 auVar176 [16];
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar182;
  float fVar198;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  float fVar199;
  float fVar206;
  float fVar207;
  vint4 ai_2;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar208;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  vint4 ai;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  vint4 ai_1;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  RTCFilterFunctionNArguments local_8d0;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  Geometry *local_890;
  undefined1 (*local_888) [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined8 uStack_798;
  LinearSpace3fa *local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  uint local_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  uint uStack_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  float local_700;
  undefined1 auStack_6fc [8];
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined4 local_680;
  int local_67c;
  undefined1 local_670 [16];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  byte local_630;
  float local_620 [4];
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [64];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar219 [64];
  
  PVar8 = prim[1];
  uVar94 = (ulong)(byte)PVar8;
  fVar199 = *(float *)(prim + uVar94 * 0x19 + 0x12);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar106 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + uVar94 * 0x19 + 6));
  auVar183._0_4_ = fVar199 * auVar106._0_4_;
  auVar183._4_4_ = fVar199 * auVar106._4_4_;
  auVar183._8_4_ = fVar199 * auVar106._8_4_;
  auVar183._12_4_ = fVar199 * auVar106._12_4_;
  auVar160._0_4_ = fVar199 * auVar104._0_4_;
  auVar160._4_4_ = fVar199 * auVar104._4_4_;
  auVar160._8_4_ = fVar199 * auVar104._8_4_;
  auVar160._12_4_ = fVar199 * auVar104._12_4_;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 5 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xb + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar94 + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  uVar99 = (ulong)(uint)((int)(uVar94 * 9) * 2);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + 6)));
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + uVar94 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  uVar91 = (ulong)(uint)((int)(uVar94 * 5) << 2);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar228._4_4_ = auVar160._0_4_;
  auVar228._0_4_ = auVar160._0_4_;
  auVar228._8_4_ = auVar160._0_4_;
  auVar228._12_4_ = auVar160._0_4_;
  auVar30 = vshufps_avx(auVar160,auVar160,0x55);
  auVar105 = vshufps_avx(auVar160,auVar160,0xaa);
  fVar199 = auVar105._0_4_;
  auVar177._0_4_ = fVar199 * auVar108._0_4_;
  fVar206 = auVar105._4_4_;
  auVar177._4_4_ = fVar206 * auVar108._4_4_;
  fVar207 = auVar105._8_4_;
  auVar177._8_4_ = fVar207 * auVar108._8_4_;
  fVar208 = auVar105._12_4_;
  auVar177._12_4_ = fVar208 * auVar108._12_4_;
  auVar110._0_4_ = auVar164._0_4_ * fVar199;
  auVar110._4_4_ = auVar164._4_4_ * fVar206;
  auVar110._8_4_ = auVar164._8_4_ * fVar207;
  auVar110._12_4_ = auVar164._12_4_ * fVar208;
  auVar161._0_4_ = auVar29._0_4_ * fVar199;
  auVar161._4_4_ = auVar29._4_4_ * fVar206;
  auVar161._8_4_ = auVar29._8_4_ * fVar207;
  auVar161._12_4_ = auVar29._12_4_ * fVar208;
  auVar105 = vfmadd231ps_fma(auVar177,auVar30,auVar104);
  auVar109 = vfmadd231ps_fma(auVar110,auVar30,auVar28);
  auVar30 = vfmadd231ps_fma(auVar161,auVar107,auVar30);
  auVar103 = vfmadd231ps_fma(auVar105,auVar228,auVar106);
  auVar109 = vfmadd231ps_fma(auVar109,auVar228,auVar27);
  auVar160 = vfmadd231ps_fma(auVar30,auVar163,auVar228);
  auVar229._4_4_ = auVar183._0_4_;
  auVar229._0_4_ = auVar183._0_4_;
  auVar229._8_4_ = auVar183._0_4_;
  auVar229._12_4_ = auVar183._0_4_;
  auVar30 = vshufps_avx(auVar183,auVar183,0x55);
  auVar105 = vshufps_avx(auVar183,auVar183,0xaa);
  fVar199 = auVar105._0_4_;
  auVar230._0_4_ = fVar199 * auVar108._0_4_;
  fVar206 = auVar105._4_4_;
  auVar230._4_4_ = fVar206 * auVar108._4_4_;
  fVar207 = auVar105._8_4_;
  auVar230._8_4_ = fVar207 * auVar108._8_4_;
  fVar208 = auVar105._12_4_;
  auVar230._12_4_ = fVar208 * auVar108._12_4_;
  auVar200._0_4_ = auVar164._0_4_ * fVar199;
  auVar200._4_4_ = auVar164._4_4_ * fVar206;
  auVar200._8_4_ = auVar164._8_4_ * fVar207;
  auVar200._12_4_ = auVar164._12_4_ * fVar208;
  auVar184._0_4_ = auVar29._0_4_ * fVar199;
  auVar184._4_4_ = auVar29._4_4_ * fVar206;
  auVar184._8_4_ = auVar29._8_4_ * fVar207;
  auVar184._12_4_ = auVar29._12_4_ * fVar208;
  auVar104 = vfmadd231ps_fma(auVar230,auVar30,auVar104);
  auVar108 = vfmadd231ps_fma(auVar200,auVar30,auVar28);
  auVar28 = vfmadd231ps_fma(auVar184,auVar30,auVar107);
  auVar164 = vfmadd231ps_fma(auVar104,auVar229,auVar106);
  auVar107 = vfmadd231ps_fma(auVar108,auVar229,auVar27);
  auVar220._8_4_ = 0x7fffffff;
  auVar220._0_8_ = 0x7fffffff7fffffff;
  auVar220._12_4_ = 0x7fffffff;
  auVar29 = vfmadd231ps_fma(auVar28,auVar229,auVar163);
  auVar106 = vandps_avx(auVar103,auVar220);
  auVar216._8_4_ = 0x219392ef;
  auVar216._0_8_ = 0x219392ef219392ef;
  auVar216._12_4_ = 0x219392ef;
  uVar99 = vcmpps_avx512vl(auVar106,auVar216,1);
  bVar13 = (bool)((byte)uVar99 & 1);
  auVar105._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._0_4_;
  bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._4_4_;
  bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._8_4_;
  bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._12_4_;
  auVar106 = vandps_avx(auVar109,auVar220);
  uVar99 = vcmpps_avx512vl(auVar106,auVar216,1);
  bVar13 = (bool)((byte)uVar99 & 1);
  auVar103._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar109._0_4_;
  bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar109._4_4_;
  bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar109._8_4_;
  bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar109._12_4_;
  auVar106 = vandps_avx(auVar160,auVar220);
  uVar99 = vcmpps_avx512vl(auVar106,auVar216,1);
  bVar13 = (bool)((byte)uVar99 & 1);
  auVar109._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar160._0_4_;
  bVar13 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar160._4_4_;
  bVar13 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar160._8_4_;
  bVar13 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar160._12_4_;
  auVar104 = vrcp14ps_avx512vl(auVar105);
  auVar217._8_4_ = 0x3f800000;
  auVar217._0_8_ = &DAT_3f8000003f800000;
  auVar217._12_4_ = 0x3f800000;
  auVar106 = vfnmadd213ps_fma(auVar105,auVar104,auVar217);
  auVar27 = vfmadd132ps_fma(auVar106,auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar103);
  auVar106 = vfnmadd213ps_fma(auVar103,auVar104,auVar217);
  auVar28 = vfmadd132ps_fma(auVar106,auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar109);
  auVar106 = vfnmadd213ps_fma(auVar109,auVar104,auVar217);
  auVar163 = vfmadd132ps_fma(auVar106,auVar104,auVar104);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar94 * 7 + 6);
  auVar106 = vpmovsxwd_avx(auVar106);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar164);
  auVar209._0_4_ = auVar27._0_4_ * auVar106._0_4_;
  auVar209._4_4_ = auVar27._4_4_ * auVar106._4_4_;
  auVar209._8_4_ = auVar27._8_4_ * auVar106._8_4_;
  auVar209._12_4_ = auVar27._12_4_ * auVar106._12_4_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar94 * 9 + 6);
  auVar106 = vpmovsxwd_avx(auVar104);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar164);
  auVar105 = vpbroadcastd_avx512vl();
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar104 = vpmovsxwd_avx(auVar108);
  auVar178._0_4_ = auVar27._0_4_ * auVar106._0_4_;
  auVar178._4_4_ = auVar27._4_4_ * auVar106._4_4_;
  auVar178._8_4_ = auVar27._8_4_ * auVar106._8_4_;
  auVar178._12_4_ = auVar27._12_4_ * auVar106._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar94 * -2 + 6);
  auVar106 = vpmovsxwd_avx(auVar27);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar107);
  auVar218._0_4_ = auVar28._0_4_ * auVar106._0_4_;
  auVar218._4_4_ = auVar28._4_4_ * auVar106._4_4_;
  auVar218._8_4_ = auVar28._8_4_ * auVar106._8_4_;
  auVar218._12_4_ = auVar28._12_4_ * auVar106._12_4_;
  auVar219 = ZEXT1664(auVar218);
  auVar106 = vcvtdq2ps_avx(auVar104);
  auVar106 = vsubps_avx(auVar106,auVar107);
  auVar176._0_4_ = auVar28._0_4_ * auVar106._0_4_;
  auVar176._4_4_ = auVar28._4_4_ * auVar106._4_4_;
  auVar176._8_4_ = auVar28._8_4_ * auVar106._8_4_;
  auVar176._12_4_ = auVar28._12_4_ * auVar106._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar91 + uVar94 + 6);
  auVar106 = vpmovsxwd_avx(auVar28);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar29);
  auVar201._0_4_ = auVar163._0_4_ * auVar106._0_4_;
  auVar201._4_4_ = auVar163._4_4_ * auVar106._4_4_;
  auVar201._8_4_ = auVar163._8_4_ * auVar106._8_4_;
  auVar201._12_4_ = auVar163._12_4_ * auVar106._12_4_;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar94 * 0x17 + 6);
  auVar106 = vpmovsxwd_avx(auVar164);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar29);
  auVar162._0_4_ = auVar163._0_4_ * auVar106._0_4_;
  auVar162._4_4_ = auVar163._4_4_ * auVar106._4_4_;
  auVar162._8_4_ = auVar163._8_4_ * auVar106._8_4_;
  auVar162._12_4_ = auVar163._12_4_ * auVar106._12_4_;
  auVar106 = vpminsd_avx(auVar209,auVar178);
  auVar104 = vpminsd_avx(auVar218,auVar176);
  auVar106 = vmaxps_avx(auVar106,auVar104);
  auVar104 = vpminsd_avx(auVar201,auVar162);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar163._4_4_ = uVar159;
  auVar163._0_4_ = uVar159;
  auVar163._8_4_ = uVar159;
  auVar163._12_4_ = uVar159;
  auVar104 = vmaxps_avx512vl(auVar104,auVar163);
  auVar106 = vmaxps_avx(auVar106,auVar104);
  auVar107._8_4_ = 0x3f7ffffa;
  auVar107._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar107._12_4_ = 0x3f7ffffa;
  local_530 = vmulps_avx512vl(auVar106,auVar107);
  auVar197 = ZEXT1664(local_530);
  auVar106 = vpmaxsd_avx(auVar209,auVar178);
  auVar104 = vpmaxsd_avx(auVar218,auVar176);
  auVar106 = vminps_avx(auVar106,auVar104);
  auVar104 = vpmaxsd_avx(auVar201,auVar162);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar29._4_4_ = uVar159;
  auVar29._0_4_ = uVar159;
  auVar29._8_4_ = uVar159;
  auVar29._12_4_ = uVar159;
  auVar104 = vminps_avx512vl(auVar104,auVar29);
  auVar106 = vminps_avx(auVar106,auVar104);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar106 = vmulps_avx512vl(auVar106,auVar30);
  uVar31 = vcmpps_avx512vl(local_530,auVar106,2);
  uVar99 = vpcmpgtd_avx512vl(auVar105,_DAT_01ff0cf0);
  uVar99 = ((byte)uVar31 & 0xf) & uVar99;
  if ((char)uVar99 != '\0') {
    local_788 = pre->ray_space + k;
    local_888 = (undefined1 (*) [32])local_100;
    auVar174 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar174);
    do {
      auVar195 = auVar219._0_32_;
      auVar136 = auVar197._0_32_;
      local_800 = in_ZMM21._0_32_;
      local_7e0 = in_ZMM20._0_32_;
      lVar33 = 0;
      for (uVar91 = uVar99; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
        lVar33 = lVar33 + 1;
      }
      uVar97 = *(uint *)(prim + 2);
      uVar9 = *(uint *)(prim + lVar33 * 4 + 6);
      pGVar96 = (context->scene->geometries).items[uVar97].ptr;
      uVar91 = (ulong)*(uint *)(*(long *)&pGVar96->field_0x58 +
                               pGVar96[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar9);
      p_Var12 = pGVar96[1].intersectionFilterN;
      lVar33 = *(long *)&pGVar96[1].time_range.upper;
      auVar106 = *(undefined1 (*) [16])(lVar33 + (long)p_Var12 * uVar91);
      pauVar3 = (undefined1 (*) [16])(lVar33 + (uVar91 + 1) * (long)p_Var12);
      uVar31 = *(undefined8 *)*pauVar3;
      uVar80 = *(undefined8 *)(*pauVar3 + 8);
      auVar28 = *pauVar3;
      auVar104 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar33 + (uVar91 + 2) * (long)p_Var12);
      uVar81 = *(undefined8 *)*pauVar4;
      uVar82 = *(undefined8 *)(*pauVar4 + 8);
      auVar27 = *pauVar4;
      auVar108 = *pauVar4;
      uVar99 = uVar99 - 1 & uVar99;
      pauVar5 = (undefined1 (*) [12])(lVar33 + (uVar91 + 3) * (long)p_Var12);
      local_640 = *(undefined8 *)*pauVar5;
      uStack_638 = *(undefined8 *)(*pauVar5 + 8);
      local_8a0 = (float)local_640;
      fStack_89c = (float)((ulong)local_640 >> 0x20);
      fStack_898 = (float)uStack_638;
      fStack_894 = (float)((ulong)uStack_638 >> 0x20);
      if (uVar99 != 0) {
        uVar94 = uVar99 - 1 & uVar99;
        for (uVar91 = uVar99; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
        }
        if (uVar94 != 0) {
          for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar10 = (int)pGVar96[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar164 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar164 = vinsertps_avx(auVar164,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar107 = vsubps_avx(auVar106,auVar164);
      uVar159 = auVar107._0_4_;
      auVar179._4_4_ = uVar159;
      auVar179._0_4_ = uVar159;
      auVar179._8_4_ = uVar159;
      auVar179._12_4_ = uVar159;
      auVar163 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      aVar6 = (local_788->vx).field_0;
      aVar7 = (local_788->vy).field_0;
      fVar199 = (local_788->vz).field_0.m128[0];
      fVar206 = *(float *)((long)&(local_788->vz).field_0 + 4);
      fVar207 = *(float *)((long)&(local_788->vz).field_0 + 8);
      fVar208 = *(float *)((long)&(local_788->vz).field_0 + 0xc);
      auVar223._0_4_ = fVar199 * auVar107._0_4_;
      auVar223._4_4_ = fVar206 * auVar107._4_4_;
      auVar223._8_4_ = fVar207 * auVar107._8_4_;
      auVar223._12_4_ = fVar208 * auVar107._12_4_;
      auVar163 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar7,auVar163);
      auVar30 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar6,auVar179);
      auVar163 = vshufps_avx(auVar106,auVar106,0xff);
      auVar29 = vsubps_avx(auVar104,auVar164);
      uVar159 = auVar29._0_4_;
      auVar185._4_4_ = uVar159;
      auVar185._0_4_ = uVar159;
      auVar185._8_4_ = uVar159;
      auVar185._12_4_ = uVar159;
      auVar107 = vshufps_avx(auVar29,auVar29,0x55);
      auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
      auVar224._0_4_ = fVar199 * auVar29._0_4_;
      auVar224._4_4_ = fVar206 * auVar29._4_4_;
      auVar224._8_4_ = fVar207 * auVar29._8_4_;
      auVar224._12_4_ = fVar208 * auVar29._12_4_;
      auVar107 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar7,auVar107);
      auVar105 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar6,auVar185);
      auVar104 = vshufps_avx(auVar104,auVar104,0xff);
      auVar29 = vsubps_avx(auVar108,auVar164);
      uVar159 = auVar29._0_4_;
      auVar221._4_4_ = uVar159;
      auVar221._0_4_ = uVar159;
      auVar221._8_4_ = uVar159;
      auVar221._12_4_ = uVar159;
      auVar107 = vshufps_avx(auVar29,auVar29,0x55);
      auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
      auVar226._0_4_ = fVar199 * auVar29._0_4_;
      auVar226._4_4_ = fVar206 * auVar29._4_4_;
      auVar226._8_4_ = fVar207 * auVar29._8_4_;
      auVar226._12_4_ = fVar208 * auVar29._12_4_;
      auVar107 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar7,auVar107);
      auVar29 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar6,auVar221);
      auVar108 = vshufps_avx(auVar108,auVar108,0xff);
      auVar83._12_4_ = fStack_894;
      auVar83._0_12_ = *pauVar5;
      auVar107 = vsubps_avx512vl(auVar83,auVar164);
      uVar159 = auVar107._0_4_;
      auVar186._4_4_ = uVar159;
      auVar186._0_4_ = uVar159;
      auVar186._8_4_ = uVar159;
      auVar186._12_4_ = uVar159;
      auVar164 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      auVar227._0_4_ = fVar199 * auVar107._0_4_;
      auVar227._4_4_ = fVar206 * auVar107._4_4_;
      auVar227._8_4_ = fVar207 * auVar107._8_4_;
      auVar227._12_4_ = fVar208 * auVar107._12_4_;
      auVar164 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar7,auVar164);
      auVar164 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar6,auVar186);
      lVar33 = (long)iVar10 * 0x44;
      auVar127 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar33);
      auVar107 = vshufps_avx512vl(auVar83,auVar83,0xff);
      local_760 = vbroadcastss_avx512vl(auVar30);
      auVar111._8_4_ = 1;
      auVar111._0_8_ = 0x100000001;
      auVar111._12_4_ = 1;
      auVar111._16_4_ = 1;
      auVar111._20_4_ = 1;
      auVar111._24_4_ = 1;
      auVar111._28_4_ = 1;
      local_860 = vpermps_avx512vl(auVar111,ZEXT1632(auVar30));
      uVar175 = auVar163._0_8_;
      local_320._8_8_ = uVar175;
      local_320._0_8_ = uVar175;
      local_320._16_8_ = uVar175;
      local_320._24_8_ = uVar175;
      auVar128 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar33 + 0x484);
      uVar159 = auVar105._0_4_;
      local_880._4_4_ = uVar159;
      local_880._0_4_ = uVar159;
      local_880._8_4_ = uVar159;
      local_880._12_4_ = uVar159;
      local_880._16_4_ = uVar159;
      local_880._20_4_ = uVar159;
      local_880._24_4_ = uVar159;
      local_880._28_4_ = uVar159;
      local_520 = vpermps_avx512vl(auVar111,ZEXT1632(auVar105));
      uVar175 = auVar104._0_8_;
      local_340._8_8_ = uVar175;
      local_340._0_8_ = uVar175;
      local_340._16_8_ = uVar175;
      local_340._24_8_ = uVar175;
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar33 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar29);
      local_380 = vpermps_avx512vl(auVar111,ZEXT1632(auVar29));
      local_3a0 = vbroadcastsd_avx512vl(auVar108);
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar33 + 0xd8c);
      local_820 = vbroadcastss_avx512vl(auVar164);
      auVar174 = ZEXT3264(local_820);
      local_840 = vpermps_avx512vl(auVar111,ZEXT1632(auVar164));
      auVar237 = ZEXT3264(local_840);
      _local_3c0 = vbroadcastsd_avx512vl(auVar107);
      auVar111 = vmulps_avx512vl(local_820,auVar125);
      auVar112 = vmulps_avx512vl(local_840,auVar125);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar126,local_360);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar126,local_380);
      auVar104 = vfmadd231ps_fma(auVar111,auVar128,local_880);
      auVar113 = vfmadd231ps_avx512vl(auVar112,auVar128,local_520);
      auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar127,local_760);
      auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar33);
      auVar112 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar33 + 0x484);
      auVar115 = vfmadd231ps_avx512vl(auVar113,auVar127,local_860);
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar33 + 0x908);
      auVar124 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar33 + 0xd8c);
      auVar116 = vmulps_avx512vl(local_820,auVar124);
      auVar117 = vmulps_avx512vl(local_840,auVar124);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar113,local_360);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,local_380);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar112,local_880);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar112,local_520);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar111,local_760);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar111,local_860);
      auVar118 = vsubps_avx512vl(auVar116,auVar114);
      auVar119 = vsubps_avx512vl(auVar117,auVar115);
      auVar120 = vmulps_avx512vl(auVar115,auVar118);
      auVar121 = vmulps_avx512vl(auVar114,auVar119);
      auVar120 = vsubps_avx512vl(auVar120,auVar121);
      auVar121 = vmulps_avx512vl(_local_3c0,auVar125);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,local_3a0);
      auVar104 = vfmadd231ps_fma(auVar121,auVar128,local_340);
      auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar127,local_320);
      auVar122 = vmulps_avx512vl(_local_3c0,auVar124);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar113,local_3a0);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar112,local_340);
      auVar163 = vfmadd231ps_fma(auVar122,auVar111,local_320);
      auVar122 = vmulps_avx512vl(auVar119,auVar119);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar118,auVar118);
      auVar123 = vmaxps_avx512vl(auVar121,ZEXT1632(auVar163));
      auVar123 = vmulps_avx512vl(auVar123,auVar123);
      auVar122 = vmulps_avx512vl(auVar123,auVar122);
      auVar120 = vmulps_avx512vl(auVar120,auVar120);
      uVar175 = vcmpps_avx512vl(auVar120,auVar122,2);
      auVar104 = vblendps_avx(auVar30,auVar106,8);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar108 = vandps_avx512vl(auVar104,auVar107);
      auVar104 = vblendps_avx(auVar105,*pauVar3,8);
      auVar104 = vandps_avx512vl(auVar104,auVar107);
      auVar108 = vmaxps_avx(auVar108,auVar104);
      auVar104 = vblendps_avx(auVar29,*pauVar4,8);
      auVar109 = vandps_avx512vl(auVar104,auVar107);
      auVar104 = vblendps_avx(auVar164,auVar83,8);
      auVar104 = vandps_avx512vl(auVar104,auVar107);
      auVar104 = vmaxps_avx(auVar109,auVar104);
      auVar104 = vmaxps_avx(auVar108,auVar104);
      auVar108 = vmovshdup_avx(auVar104);
      auVar108 = vmaxss_avx(auVar108,auVar104);
      auVar104 = vshufpd_avx(auVar104,auVar104,1);
      auVar104 = vmaxss_avx(auVar104,auVar108);
      auVar122._0_4_ = (float)iVar10;
      _auStack_6fc = auVar30._4_12_;
      auVar122._4_4_ = auVar122._0_4_;
      auVar122._8_4_ = auVar122._0_4_;
      auVar122._12_4_ = auVar122._0_4_;
      auVar122._16_4_ = auVar122._0_4_;
      auVar122._20_4_ = auVar122._0_4_;
      auVar122._24_4_ = auVar122._0_4_;
      auVar122._28_4_ = auVar122._0_4_;
      uVar32 = vcmpps_avx512vl(auVar122,_DAT_02020f40,0xe);
      bVar100 = (byte)uVar175 & (byte)uVar32;
      auVar104 = vmulss_avx512f(auVar104,ZEXT416(0x35000000));
      auVar120._8_4_ = 2;
      auVar120._0_8_ = 0x200000002;
      auVar120._12_4_ = 2;
      auVar120._16_4_ = 2;
      auVar120._20_4_ = 2;
      auVar120._24_4_ = 2;
      auVar120._28_4_ = 2;
      local_3e0 = vpermps_avx512vl(auVar120,ZEXT1632(auVar30));
      local_400 = vpermps_avx512vl(auVar120,ZEXT1632(auVar105));
      local_420 = vpermps_avx512vl(auVar120,ZEXT1632(auVar29));
      local_440 = vpermps_avx2(auVar120,ZEXT1632(auVar164));
      uVar95 = *(uint *)(ray + k * 4 + 0xc0);
      auVar108 = local_360._0_16_;
      local_700 = auVar122._0_4_;
      if (bVar100 == 0) {
        auVar108 = vxorps_avx512vl(auVar108,auVar108);
        auVar236 = ZEXT1664(auVar108);
        auVar219 = ZEXT3264(auVar195);
        in_ZMM20 = ZEXT3264(local_7e0);
        auVar197 = ZEXT3264(auVar136);
        in_ZMM21 = ZEXT3264(local_800);
        auVar235 = ZEXT3264(local_760);
        auVar234 = ZEXT3264(local_860);
        auVar233 = ZEXT3264(local_880);
      }
      else {
        local_780._0_16_ = ZEXT416(uVar95);
        local_740._0_16_ = auVar104;
        auVar124 = vmulps_avx512vl(local_440,auVar124);
        auVar113 = vfmadd213ps_avx512vl(auVar113,local_420,auVar124);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_400,auVar113);
        auVar124 = vfmadd213ps_avx512vl(auVar111,local_3e0,auVar112);
        auVar125 = vmulps_avx512vl(local_440,auVar125);
        auVar126 = vfmadd213ps_avx512vl(auVar126,local_420,auVar125);
        auVar112 = vfmadd213ps_avx512vl(auVar128,local_400,auVar126);
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar33 + 0x1210);
        auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar33 + 0x1694);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar33 + 0x1b18);
        auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar33 + 0x1f9c);
        auVar120 = vfmadd213ps_avx512vl(auVar127,local_3e0,auVar112);
        auVar127 = vmulps_avx512vl(local_820,auVar111);
        auVar112 = vmulps_avx512vl(local_840,auVar111);
        auVar111 = vmulps_avx512vl(local_440,auVar111);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar125,local_360);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar125,local_380);
        auVar125 = vfmadd231ps_avx512vl(auVar111,local_420,auVar125);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar126,local_880);
        auVar111 = vfmadd231ps_avx512vl(auVar112,auVar126,local_520);
        auVar112 = vfmadd231ps_avx512vl(auVar125,local_400,auVar126);
        auVar113 = vfmadd231ps_avx512vl(auVar127,auVar128,local_760);
        auVar234 = ZEXT3264(local_860);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar128,local_860);
        auVar127 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar33 + 0x1210);
        auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar33 + 0x1b18);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar33 + 0x1f9c);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_3e0,auVar128);
        auVar128 = vmulps_avx512vl(local_820,auVar125);
        auVar123 = vmulps_avx512vl(local_840,auVar125);
        auVar125 = vmulps_avx512vl(local_440,auVar125);
        auVar238 = ZEXT1664(auVar104);
        auVar129 = vfmadd231ps_avx512vl(auVar128,auVar126,local_360);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar126,local_380);
        auVar126 = vfmadd231ps_avx512vl(auVar125,local_420,auVar126);
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar33 + 0x1694);
        auVar125 = vfmadd231ps_avx512vl(auVar129,auVar128,local_880);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar128,local_520);
        auVar128 = vfmadd231ps_avx512vl(auVar126,local_400,auVar128);
        auVar126 = vfmadd231ps_avx512vl(auVar125,auVar127,local_760);
        auVar125 = vfmadd231ps_avx512vl(auVar123,auVar127,local_860);
        auVar123 = vfmadd231ps_avx512vl(auVar128,local_3e0,auVar127);
        auVar231._8_4_ = 0x7fffffff;
        auVar231._0_8_ = 0x7fffffff7fffffff;
        auVar231._12_4_ = 0x7fffffff;
        auVar231._16_4_ = 0x7fffffff;
        auVar231._20_4_ = 0x7fffffff;
        auVar231._24_4_ = 0x7fffffff;
        auVar231._28_4_ = 0x7fffffff;
        auVar127 = vandps_avx(auVar113,auVar231);
        auVar128 = vandps_avx(auVar111,auVar231);
        auVar128 = vmaxps_avx(auVar127,auVar128);
        auVar127 = vandps_avx(auVar112,auVar231);
        auVar127 = vmaxps_avx(auVar128,auVar127);
        auVar112 = vbroadcastss_avx512vl(auVar104);
        uVar91 = vcmpps_avx512vl(auVar127,auVar112,1);
        bVar13 = (bool)((byte)uVar91 & 1);
        auVar129._0_4_ = (float)((uint)bVar13 * auVar118._0_4_ | (uint)!bVar13 * auVar113._0_4_);
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar113._4_4_);
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar113._8_4_);
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar113._12_4_);
        bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar13 * auVar118._16_4_ | (uint)!bVar13 * auVar113._16_4_);
        bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar13 * auVar118._20_4_ | (uint)!bVar13 * auVar113._20_4_);
        bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar13 * auVar118._24_4_ | (uint)!bVar13 * auVar113._24_4_);
        bVar13 = SUB81(uVar91 >> 7,0);
        auVar129._28_4_ = (uint)bVar13 * auVar118._28_4_ | (uint)!bVar13 * auVar113._28_4_;
        bVar13 = (bool)((byte)uVar91 & 1);
        auVar130._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar111._0_4_);
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar111._4_4_);
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar111._8_4_);
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar111._12_4_);
        bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
        auVar130._16_4_ = (float)((uint)bVar13 * auVar119._16_4_ | (uint)!bVar13 * auVar111._16_4_);
        bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
        auVar130._20_4_ = (float)((uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * auVar111._20_4_);
        bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
        auVar130._24_4_ = (float)((uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * auVar111._24_4_);
        bVar13 = SUB81(uVar91 >> 7,0);
        auVar130._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar111._28_4_;
        auVar127 = vandps_avx(auVar231,auVar126);
        auVar128 = vandps_avx(auVar125,auVar231);
        auVar128 = vmaxps_avx(auVar127,auVar128);
        auVar127 = vandps_avx(auVar123,auVar231);
        auVar127 = vmaxps_avx(auVar128,auVar127);
        uVar91 = vcmpps_avx512vl(auVar127,auVar112,1);
        bVar13 = (bool)((byte)uVar91 & 1);
        auVar123._0_4_ = (float)((uint)bVar13 * auVar118._0_4_ | (uint)!bVar13 * auVar126._0_4_);
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar126._4_4_);
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar126._8_4_);
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar126._12_4_);
        bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar13 * auVar118._16_4_ | (uint)!bVar13 * auVar126._16_4_);
        bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar13 * auVar118._20_4_ | (uint)!bVar13 * auVar126._20_4_);
        bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar13 * auVar118._24_4_ | (uint)!bVar13 * auVar126._24_4_);
        bVar13 = SUB81(uVar91 >> 7,0);
        auVar123._28_4_ = (uint)bVar13 * auVar118._28_4_ | (uint)!bVar13 * auVar126._28_4_;
        bVar13 = (bool)((byte)uVar91 & 1);
        auVar118._0_4_ = (float)((uint)bVar13 * auVar119._0_4_ | (uint)!bVar13 * auVar125._0_4_);
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar125._4_4_);
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar125._8_4_);
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar125._12_4_);
        bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar13 * auVar119._16_4_ | (uint)!bVar13 * auVar125._16_4_);
        bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar13 * auVar119._20_4_ | (uint)!bVar13 * auVar125._20_4_);
        bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar13 * auVar119._24_4_ | (uint)!bVar13 * auVar125._24_4_);
        bVar13 = SUB81(uVar91 >> 7,0);
        auVar118._28_4_ = (uint)bVar13 * auVar119._28_4_ | (uint)!bVar13 * auVar125._28_4_;
        auVar110 = vxorps_avx512vl(auVar108,auVar108);
        auVar236 = ZEXT1664(auVar110);
        auVar127 = vfmadd213ps_avx512vl(auVar129,auVar129,ZEXT1632(auVar110));
        auVar108 = vfmadd231ps_fma(auVar127,auVar130,auVar130);
        auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar108));
        fVar199 = auVar126._0_4_;
        fVar206 = auVar126._4_4_;
        fVar207 = auVar126._8_4_;
        fVar208 = auVar126._12_4_;
        fVar182 = auVar126._16_4_;
        fVar198 = auVar126._20_4_;
        fVar101 = auVar126._24_4_;
        auVar127._4_4_ = fVar206 * fVar206 * fVar206 * auVar108._4_4_ * -0.5;
        auVar127._0_4_ = fVar199 * fVar199 * fVar199 * auVar108._0_4_ * -0.5;
        auVar127._8_4_ = fVar207 * fVar207 * fVar207 * auVar108._8_4_ * -0.5;
        auVar127._12_4_ = fVar208 * fVar208 * fVar208 * auVar108._12_4_ * -0.5;
        auVar127._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar127._20_4_ = fVar198 * fVar198 * fVar198 * -0.0;
        auVar127._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
        auVar127._28_4_ = 0;
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar111,auVar126);
        auVar128._4_4_ = auVar130._4_4_ * auVar127._4_4_;
        auVar128._0_4_ = auVar130._0_4_ * auVar127._0_4_;
        auVar128._8_4_ = auVar130._8_4_ * auVar127._8_4_;
        auVar128._12_4_ = auVar130._12_4_ * auVar127._12_4_;
        auVar128._16_4_ = auVar130._16_4_ * auVar127._16_4_;
        auVar128._20_4_ = auVar130._20_4_ * auVar127._20_4_;
        auVar128._24_4_ = auVar130._24_4_ * auVar127._24_4_;
        auVar128._28_4_ = auVar126._28_4_;
        auVar126._4_4_ = auVar127._4_4_ * -auVar129._4_4_;
        auVar126._0_4_ = auVar127._0_4_ * -auVar129._0_4_;
        auVar126._8_4_ = auVar127._8_4_ * -auVar129._8_4_;
        auVar126._12_4_ = auVar127._12_4_ * -auVar129._12_4_;
        auVar126._16_4_ = auVar127._16_4_ * -auVar129._16_4_;
        auVar126._20_4_ = auVar127._20_4_ * -auVar129._20_4_;
        auVar126._24_4_ = auVar127._24_4_ * -auVar129._24_4_;
        auVar126._28_4_ = auVar129._28_4_ ^ 0x80000000;
        auVar119 = vmulps_avx512vl(auVar127,ZEXT1632(auVar110));
        auVar129 = ZEXT1632(auVar110);
        auVar125 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar129);
        auVar108 = vfmadd231ps_fma(auVar125,auVar118,auVar118);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar108));
        fVar199 = auVar113._0_4_;
        fVar206 = auVar113._4_4_;
        fVar207 = auVar113._8_4_;
        fVar208 = auVar113._12_4_;
        fVar182 = auVar113._16_4_;
        fVar198 = auVar113._20_4_;
        fVar101 = auVar113._24_4_;
        auVar125._4_4_ = fVar206 * fVar206 * fVar206 * auVar108._4_4_ * -0.5;
        auVar125._0_4_ = fVar199 * fVar199 * fVar199 * auVar108._0_4_ * -0.5;
        auVar125._8_4_ = fVar207 * fVar207 * fVar207 * auVar108._8_4_ * -0.5;
        auVar125._12_4_ = fVar208 * fVar208 * fVar208 * auVar108._12_4_ * -0.5;
        auVar125._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar125._20_4_ = fVar198 * fVar198 * fVar198 * -0.0;
        auVar125._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
        auVar125._28_4_ = 0;
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar111,auVar113);
        auVar112._4_4_ = auVar118._4_4_ * auVar125._4_4_;
        auVar112._0_4_ = auVar118._0_4_ * auVar125._0_4_;
        auVar112._8_4_ = auVar118._8_4_ * auVar125._8_4_;
        auVar112._12_4_ = auVar118._12_4_ * auVar125._12_4_;
        auVar112._16_4_ = auVar118._16_4_ * auVar125._16_4_;
        auVar112._20_4_ = auVar118._20_4_ * auVar125._20_4_;
        auVar112._24_4_ = auVar118._24_4_ * auVar125._24_4_;
        auVar112._28_4_ = auVar113._28_4_;
        auVar113._4_4_ = -auVar123._4_4_ * auVar125._4_4_;
        auVar113._0_4_ = -auVar123._0_4_ * auVar125._0_4_;
        auVar113._8_4_ = -auVar123._8_4_ * auVar125._8_4_;
        auVar113._12_4_ = -auVar123._12_4_ * auVar125._12_4_;
        auVar113._16_4_ = -auVar123._16_4_ * auVar125._16_4_;
        auVar113._20_4_ = -auVar123._20_4_ * auVar125._20_4_;
        auVar113._24_4_ = -auVar123._24_4_ * auVar125._24_4_;
        auVar113._28_4_ = auVar127._28_4_;
        auVar127 = vmulps_avx512vl(auVar125,auVar129);
        auVar108 = vfmadd213ps_fma(auVar128,auVar121,auVar114);
        auVar164 = vfmadd213ps_fma(auVar126,auVar121,auVar115);
        auVar125 = vfmadd213ps_avx512vl(auVar119,auVar121,auVar120);
        auVar111 = vfmadd213ps_avx512vl(auVar112,ZEXT1632(auVar163),auVar116);
        auVar109 = vfnmadd213ps_fma(auVar128,auVar121,auVar114);
        auVar114 = ZEXT1632(auVar163);
        auVar107 = vfmadd213ps_fma(auVar113,auVar114,auVar117);
        auVar103 = vfnmadd213ps_fma(auVar126,auVar121,auVar115);
        auVar29 = vfmadd213ps_fma(auVar127,auVar114,auVar124);
        auVar128 = vfnmadd231ps_avx512vl(auVar120,auVar121,auVar119);
        auVar160 = vfnmadd213ps_fma(auVar112,auVar114,auVar116);
        auVar161 = vfnmadd213ps_fma(auVar113,auVar114,auVar117);
        auVar162 = vfnmadd231ps_fma(auVar124,ZEXT1632(auVar163),auVar127);
        auVar126 = vsubps_avx512vl(auVar111,ZEXT1632(auVar109));
        auVar127 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar103));
        auVar112 = vsubps_avx512vl(ZEXT1632(auVar29),auVar128);
        auVar113 = vmulps_avx512vl(auVar127,auVar128);
        auVar30 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar103),auVar112);
        auVar124._4_4_ = auVar109._4_4_ * auVar112._4_4_;
        auVar124._0_4_ = auVar109._0_4_ * auVar112._0_4_;
        auVar124._8_4_ = auVar109._8_4_ * auVar112._8_4_;
        auVar124._12_4_ = auVar109._12_4_ * auVar112._12_4_;
        auVar124._16_4_ = auVar112._16_4_ * 0.0;
        auVar124._20_4_ = auVar112._20_4_ * 0.0;
        auVar124._24_4_ = auVar112._24_4_ * 0.0;
        auVar124._28_4_ = auVar112._28_4_;
        auVar112 = vfmsub231ps_avx512vl(auVar124,auVar128,auVar126);
        auVar114._4_4_ = auVar103._4_4_ * auVar126._4_4_;
        auVar114._0_4_ = auVar103._0_4_ * auVar126._0_4_;
        auVar114._8_4_ = auVar103._8_4_ * auVar126._8_4_;
        auVar114._12_4_ = auVar103._12_4_ * auVar126._12_4_;
        auVar114._16_4_ = auVar126._16_4_ * 0.0;
        auVar114._20_4_ = auVar126._20_4_ * 0.0;
        auVar114._24_4_ = auVar126._24_4_ * 0.0;
        auVar114._28_4_ = auVar126._28_4_;
        auVar105 = vfmsub231ps_fma(auVar114,ZEXT1632(auVar109),auVar127);
        auVar127 = vfmadd231ps_avx512vl(ZEXT1632(auVar105),auVar129,auVar112);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar129,ZEXT1632(auVar30));
        auVar118 = ZEXT1632(auVar110);
        uVar91 = vcmpps_avx512vl(auVar127,auVar118,2);
        bVar90 = (byte)uVar91;
        fVar101 = (float)((uint)(bVar90 & 1) * auVar108._0_4_ |
                         (uint)!(bool)(bVar90 & 1) * auVar160._0_4_);
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        fVar150 = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar160._4_4_);
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        fVar152 = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar160._8_4_);
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        fVar155 = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar160._12_4_);
        auVar113 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar152,CONCAT44(fVar150,fVar101))));
        fVar102 = (float)((uint)(bVar90 & 1) * auVar164._0_4_ |
                         (uint)!(bool)(bVar90 & 1) * auVar161._0_4_);
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        fVar151 = (float)((uint)bVar13 * auVar164._4_4_ | (uint)!bVar13 * auVar161._4_4_);
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        fVar153 = (float)((uint)bVar13 * auVar164._8_4_ | (uint)!bVar13 * auVar161._8_4_);
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        fVar156 = (float)((uint)bVar13 * auVar164._12_4_ | (uint)!bVar13 * auVar161._12_4_);
        auVar124 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar153,CONCAT44(fVar151,fVar102))));
        auVar119._0_4_ =
             (float)((uint)(bVar90 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar90 & 1) * auVar162._0_4_);
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar162._4_4_);
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar162._8_4_);
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar162._12_4_);
        fVar199 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar125._16_4_);
        auVar119._16_4_ = fVar199;
        fVar206 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar125._20_4_);
        auVar119._20_4_ = fVar206;
        fVar207 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar125._24_4_);
        auVar119._24_4_ = fVar207;
        iVar1 = (uint)(byte)(uVar91 >> 7) * auVar125._28_4_;
        auVar119._28_4_ = iVar1;
        auVar126 = vblendmps_avx512vl(ZEXT1632(auVar109),auVar111);
        auVar131._0_4_ =
             (uint)(bVar90 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar30._0_4_;
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar30._4_4_;
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar30._8_4_;
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar30._12_4_;
        auVar131._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * auVar126._16_4_;
        auVar131._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * auVar126._20_4_;
        auVar131._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * auVar126._24_4_;
        auVar131._28_4_ = (uint)(byte)(uVar91 >> 7) * auVar126._28_4_;
        auVar126 = vblendmps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar107));
        auVar132._0_4_ =
             (float)((uint)(bVar90 & 1) * auVar126._0_4_ |
                    (uint)!(bool)(bVar90 & 1) * auVar164._0_4_);
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar164._4_4_);
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar164._8_4_);
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar164._12_4_);
        fVar198 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar126._16_4_);
        auVar132._16_4_ = fVar198;
        fVar182 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar126._20_4_);
        auVar132._20_4_ = fVar182;
        fVar208 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar126._24_4_);
        auVar132._24_4_ = fVar208;
        auVar132._28_4_ = (uint)(byte)(uVar91 >> 7) * auVar126._28_4_;
        auVar126 = vblendmps_avx512vl(auVar128,ZEXT1632(auVar29));
        auVar133._0_4_ =
             (float)((uint)(bVar90 & 1) * auVar126._0_4_ |
                    (uint)!(bool)(bVar90 & 1) * auVar125._0_4_);
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar125._4_4_);
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar125._8_4_);
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar125._12_4_);
        bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
        auVar133._16_4_ = (float)((uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * auVar125._16_4_);
        bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
        auVar133._20_4_ = (float)((uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * auVar125._20_4_);
        bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
        auVar133._24_4_ = (float)((uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * auVar125._24_4_);
        bVar13 = SUB81(uVar91 >> 7,0);
        auVar133._28_4_ = (uint)bVar13 * auVar126._28_4_ | (uint)!bVar13 * auVar125._28_4_;
        auVar134._0_4_ =
             (uint)(bVar90 & 1) * (int)auVar109._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar111._0_4_;
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar13 * (int)auVar109._4_4_ | (uint)!bVar13 * auVar111._4_4_;
        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar13 * (int)auVar109._8_4_ | (uint)!bVar13 * auVar111._8_4_;
        bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar13 * (int)auVar109._12_4_ | (uint)!bVar13 * auVar111._12_4_;
        auVar134._16_4_ = (uint)!(bool)((byte)(uVar91 >> 4) & 1) * auVar111._16_4_;
        auVar134._20_4_ = (uint)!(bool)((byte)(uVar91 >> 5) & 1) * auVar111._20_4_;
        auVar134._24_4_ = (uint)!(bool)((byte)(uVar91 >> 6) & 1) * auVar111._24_4_;
        auVar134._28_4_ = (uint)!SUB81(uVar91 >> 7,0) * auVar111._28_4_;
        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar91 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar135._0_4_ =
             (uint)(bVar90 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar29._0_4_;
        bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar14 * auVar128._4_4_ | (uint)!bVar14 * auVar29._4_4_;
        bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar14 * auVar128._8_4_ | (uint)!bVar14 * auVar29._8_4_;
        bVar14 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar14 * auVar128._12_4_ | (uint)!bVar14 * auVar29._12_4_;
        auVar135._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * auVar128._16_4_;
        auVar135._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * auVar128._20_4_;
        auVar135._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * auVar128._24_4_;
        iVar2 = (uint)(byte)(uVar91 >> 7) * auVar128._28_4_;
        auVar135._28_4_ = iVar2;
        auVar114 = vsubps_avx512vl(auVar134,auVar113);
        auVar128 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar103._12_4_ |
                                                 (uint)!bVar16 * auVar107._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar103._8_4_ |
                                                          (uint)!bVar15 * auVar107._8_4_,
                                                          CONCAT44((uint)bVar13 *
                                                                   (int)auVar103._4_4_ |
                                                                   (uint)!bVar13 * auVar107._4_4_,
                                                                   (uint)(bVar90 & 1) *
                                                                   (int)auVar103._0_4_ |
                                                                   (uint)!(bool)(bVar90 & 1) *
                                                                   auVar107._0_4_)))),auVar124);
        auVar126 = vsubps_avx(auVar135,auVar119);
        auVar125 = vsubps_avx(auVar113,auVar131);
        auVar111 = vsubps_avx(auVar124,auVar132);
        auVar112 = vsubps_avx(auVar119,auVar133);
        auVar115._4_4_ = auVar126._4_4_ * fVar150;
        auVar115._0_4_ = auVar126._0_4_ * fVar101;
        auVar115._8_4_ = auVar126._8_4_ * fVar152;
        auVar115._12_4_ = auVar126._12_4_ * fVar155;
        auVar115._16_4_ = auVar126._16_4_ * 0.0;
        auVar115._20_4_ = auVar126._20_4_ * 0.0;
        auVar115._24_4_ = auVar126._24_4_ * 0.0;
        auVar115._28_4_ = iVar2;
        auVar108 = vfmsub231ps_fma(auVar115,auVar119,auVar114);
        auVar116._4_4_ = fVar151 * auVar114._4_4_;
        auVar116._0_4_ = fVar102 * auVar114._0_4_;
        auVar116._8_4_ = fVar153 * auVar114._8_4_;
        auVar116._12_4_ = fVar156 * auVar114._12_4_;
        auVar116._16_4_ = auVar114._16_4_ * 0.0;
        auVar116._20_4_ = auVar114._20_4_ * 0.0;
        auVar116._24_4_ = auVar114._24_4_ * 0.0;
        auVar116._28_4_ = auVar127._28_4_;
        auVar164 = vfmsub231ps_fma(auVar116,auVar113,auVar128);
        auVar127 = vfmadd231ps_avx512vl(ZEXT1632(auVar164),auVar118,ZEXT1632(auVar108));
        auVar202._0_4_ = auVar128._0_4_ * auVar119._0_4_;
        auVar202._4_4_ = auVar128._4_4_ * auVar119._4_4_;
        auVar202._8_4_ = auVar128._8_4_ * auVar119._8_4_;
        auVar202._12_4_ = auVar128._12_4_ * auVar119._12_4_;
        auVar202._16_4_ = auVar128._16_4_ * fVar199;
        auVar202._20_4_ = auVar128._20_4_ * fVar206;
        auVar202._24_4_ = auVar128._24_4_ * fVar207;
        auVar202._28_4_ = 0;
        auVar108 = vfmsub231ps_fma(auVar202,auVar124,auVar126);
        auVar115 = vfmadd231ps_avx512vl(auVar127,auVar118,ZEXT1632(auVar108));
        auVar127 = vmulps_avx512vl(auVar112,auVar131);
        auVar127 = vfmsub231ps_avx512vl(auVar127,auVar125,auVar133);
        auVar117._4_4_ = auVar111._4_4_ * auVar133._4_4_;
        auVar117._0_4_ = auVar111._0_4_ * auVar133._0_4_;
        auVar117._8_4_ = auVar111._8_4_ * auVar133._8_4_;
        auVar117._12_4_ = auVar111._12_4_ * auVar133._12_4_;
        auVar117._16_4_ = auVar111._16_4_ * auVar133._16_4_;
        auVar117._20_4_ = auVar111._20_4_ * auVar133._20_4_;
        auVar117._24_4_ = auVar111._24_4_ * auVar133._24_4_;
        auVar117._28_4_ = auVar133._28_4_;
        auVar108 = vfmsub231ps_fma(auVar117,auVar132,auVar112);
        auVar203._0_4_ = auVar132._0_4_ * auVar125._0_4_;
        auVar203._4_4_ = auVar132._4_4_ * auVar125._4_4_;
        auVar203._8_4_ = auVar132._8_4_ * auVar125._8_4_;
        auVar203._12_4_ = auVar132._12_4_ * auVar125._12_4_;
        auVar203._16_4_ = fVar198 * auVar125._16_4_;
        auVar203._20_4_ = fVar182 * auVar125._20_4_;
        auVar203._24_4_ = fVar208 * auVar125._24_4_;
        auVar203._28_4_ = 0;
        auVar164 = vfmsub231ps_fma(auVar203,auVar111,auVar131);
        auVar127 = vfmadd231ps_avx512vl(ZEXT1632(auVar164),auVar118,auVar127);
        auVar116 = vfmadd231ps_avx512vl(auVar127,auVar118,ZEXT1632(auVar108));
        auVar127 = vmaxps_avx(auVar115,auVar116);
        uVar175 = vcmpps_avx512vl(auVar127,auVar118,2);
        bVar100 = bVar100 & (byte)uVar175;
        in_ZMM20 = ZEXT3264(local_7e0);
        in_ZMM21 = ZEXT3264(local_800);
        auVar235 = ZEXT3264(local_760);
        auVar233 = ZEXT3264(local_880);
        if (bVar100 == 0) {
          bVar100 = 0;
          auVar219 = ZEXT3264(auVar195);
          auVar197 = ZEXT3264(auVar136);
        }
        else {
          auVar44._4_4_ = auVar112._4_4_ * auVar128._4_4_;
          auVar44._0_4_ = auVar112._0_4_ * auVar128._0_4_;
          auVar44._8_4_ = auVar112._8_4_ * auVar128._8_4_;
          auVar44._12_4_ = auVar112._12_4_ * auVar128._12_4_;
          auVar44._16_4_ = auVar112._16_4_ * auVar128._16_4_;
          auVar44._20_4_ = auVar112._20_4_ * auVar128._20_4_;
          auVar44._24_4_ = auVar112._24_4_ * auVar128._24_4_;
          auVar44._28_4_ = auVar127._28_4_;
          auVar107 = vfmsub231ps_fma(auVar44,auVar111,auVar126);
          auVar45._4_4_ = auVar126._4_4_ * auVar125._4_4_;
          auVar45._0_4_ = auVar126._0_4_ * auVar125._0_4_;
          auVar45._8_4_ = auVar126._8_4_ * auVar125._8_4_;
          auVar45._12_4_ = auVar126._12_4_ * auVar125._12_4_;
          auVar45._16_4_ = auVar126._16_4_ * auVar125._16_4_;
          auVar45._20_4_ = auVar126._20_4_ * auVar125._20_4_;
          auVar45._24_4_ = auVar126._24_4_ * auVar125._24_4_;
          auVar45._28_4_ = auVar126._28_4_;
          auVar164 = vfmsub231ps_fma(auVar45,auVar114,auVar112);
          auVar46._4_4_ = auVar111._4_4_ * auVar114._4_4_;
          auVar46._0_4_ = auVar111._0_4_ * auVar114._0_4_;
          auVar46._8_4_ = auVar111._8_4_ * auVar114._8_4_;
          auVar46._12_4_ = auVar111._12_4_ * auVar114._12_4_;
          auVar46._16_4_ = auVar111._16_4_ * auVar114._16_4_;
          auVar46._20_4_ = auVar111._20_4_ * auVar114._20_4_;
          auVar46._24_4_ = auVar111._24_4_ * auVar114._24_4_;
          auVar46._28_4_ = auVar111._28_4_;
          auVar29 = vfmsub231ps_fma(auVar46,auVar125,auVar128);
          auVar108 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar164),ZEXT1632(auVar29));
          auVar127 = vfmadd231ps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar107),auVar118);
          auVar128 = vrcp14ps_avx512vl(auVar127);
          auVar35._8_4_ = 0x3f800000;
          auVar35._0_8_ = &DAT_3f8000003f800000;
          auVar35._12_4_ = 0x3f800000;
          auVar35._16_4_ = 0x3f800000;
          auVar35._20_4_ = 0x3f800000;
          auVar35._24_4_ = 0x3f800000;
          auVar35._28_4_ = 0x3f800000;
          auVar126 = vfnmadd213ps_avx512vl(auVar128,auVar127,auVar35);
          auVar108 = vfmadd132ps_fma(auVar126,auVar128,auVar128);
          auVar47._4_4_ = auVar29._4_4_ * auVar119._4_4_;
          auVar47._0_4_ = auVar29._0_4_ * auVar119._0_4_;
          auVar47._8_4_ = auVar29._8_4_ * auVar119._8_4_;
          auVar47._12_4_ = auVar29._12_4_ * auVar119._12_4_;
          auVar47._16_4_ = fVar199 * 0.0;
          auVar47._20_4_ = fVar206 * 0.0;
          auVar47._24_4_ = fVar207 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar164 = vfmadd231ps_fma(auVar47,auVar124,ZEXT1632(auVar164));
          auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar113,ZEXT1632(auVar107));
          fVar199 = auVar108._0_4_;
          fVar206 = auVar108._4_4_;
          fVar207 = auVar108._8_4_;
          fVar208 = auVar108._12_4_;
          auVar128 = ZEXT1632(CONCAT412(auVar164._12_4_ * fVar208,
                                        CONCAT48(auVar164._8_4_ * fVar207,
                                                 CONCAT44(auVar164._4_4_ * fVar206,
                                                          auVar164._0_4_ * fVar199))));
          auVar222._4_4_ = uVar95;
          auVar222._0_4_ = uVar95;
          auVar222._8_4_ = uVar95;
          auVar222._12_4_ = uVar95;
          auVar222._16_4_ = uVar95;
          auVar222._20_4_ = uVar95;
          auVar222._24_4_ = uVar95;
          auVar222._28_4_ = uVar95;
          uVar175 = vcmpps_avx512vl(auVar222,auVar128,2);
          uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar36._4_4_ = uVar159;
          auVar36._0_4_ = uVar159;
          auVar36._8_4_ = uVar159;
          auVar36._12_4_ = uVar159;
          auVar36._16_4_ = uVar159;
          auVar36._20_4_ = uVar159;
          auVar36._24_4_ = uVar159;
          auVar36._28_4_ = uVar159;
          uVar32 = vcmpps_avx512vl(auVar128,auVar36,2);
          bVar100 = (byte)uVar175 & (byte)uVar32 & bVar100;
          if (bVar100 == 0) {
            bVar100 = 0;
            auVar219 = ZEXT3264(auVar195);
            auVar197 = ZEXT3264(auVar136);
          }
          else {
            uVar175 = vcmpps_avx512vl(auVar127,auVar118,4);
            if ((bVar100 & (byte)uVar175) == 0) {
              bVar100 = 0;
              auVar219 = ZEXT3264(auVar195);
              auVar197 = ZEXT3264(auVar136);
            }
            else {
              bVar100 = bVar100 & (byte)uVar175;
              fVar182 = auVar115._0_4_ * fVar199;
              fVar198 = auVar115._4_4_ * fVar206;
              auVar136._4_4_ = fVar198;
              auVar136._0_4_ = fVar182;
              fVar101 = auVar115._8_4_ * fVar207;
              auVar136._8_4_ = fVar101;
              fVar102 = auVar115._12_4_ * fVar208;
              auVar136._12_4_ = fVar102;
              fVar150 = auVar115._16_4_ * 0.0;
              auVar136._16_4_ = fVar150;
              fVar151 = auVar115._20_4_ * 0.0;
              auVar136._20_4_ = fVar151;
              fVar152 = auVar115._24_4_ * 0.0;
              auVar136._24_4_ = fVar152;
              auVar136._28_4_ = auVar115._28_4_;
              fVar199 = auVar116._0_4_ * fVar199;
              fVar206 = auVar116._4_4_ * fVar206;
              auVar195._4_4_ = fVar206;
              auVar195._0_4_ = fVar199;
              fVar207 = auVar116._8_4_ * fVar207;
              auVar195._8_4_ = fVar207;
              fVar208 = auVar116._12_4_ * fVar208;
              auVar195._12_4_ = fVar208;
              fVar153 = auVar116._16_4_ * 0.0;
              auVar195._16_4_ = fVar153;
              fVar155 = auVar116._20_4_ * 0.0;
              auVar195._20_4_ = fVar155;
              fVar156 = auVar116._24_4_ * 0.0;
              auVar195._24_4_ = fVar156;
              auVar195._28_4_ = auVar116._28_4_;
              auVar214._8_4_ = 0x3f800000;
              auVar214._0_8_ = &DAT_3f8000003f800000;
              auVar214._12_4_ = 0x3f800000;
              auVar214._16_4_ = 0x3f800000;
              auVar214._20_4_ = 0x3f800000;
              auVar214._24_4_ = 0x3f800000;
              auVar214._28_4_ = 0x3f800000;
              auVar136 = vsubps_avx(auVar214,auVar136);
              bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar91 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar91 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar91 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
              bVar19 = SUB81(uVar91 >> 7,0);
              auVar219 = ZEXT3264(CONCAT428((uint)bVar19 * auVar115._28_4_ |
                                            (uint)!bVar19 * auVar136._28_4_,
                                            CONCAT424((uint)bVar18 * (int)fVar152 |
                                                      (uint)!bVar18 * auVar136._24_4_,
                                                      CONCAT420((uint)bVar17 * (int)fVar151 |
                                                                (uint)!bVar17 * auVar136._20_4_,
                                                                CONCAT416((uint)bVar16 *
                                                                          (int)fVar150 |
                                                                          (uint)!bVar16 *
                                                                          auVar136._16_4_,
                                                                          CONCAT412((uint)bVar15 *
                                                                                    (int)fVar102 |
                                                                                    (uint)!bVar15 *
                                                                                    auVar136._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar14 * (int)fVar101 |
                                                  (uint)!bVar14 * auVar136._8_4_,
                                                  CONCAT44((uint)bVar13 * (int)fVar198 |
                                                           (uint)!bVar13 * auVar136._4_4_,
                                                           (uint)(bVar90 & 1) * (int)fVar182 |
                                                           (uint)!(bool)(bVar90 & 1) *
                                                           auVar136._0_4_))))))));
              auVar136 = vsubps_avx(auVar214,auVar195);
              local_560._0_4_ =
                   (uint)(bVar90 & 1) * (int)fVar199 | (uint)!(bool)(bVar90 & 1) * auVar136._0_4_;
              bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
              local_560._4_4_ = (uint)bVar13 * (int)fVar206 | (uint)!bVar13 * auVar136._4_4_;
              bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
              local_560._8_4_ = (uint)bVar13 * (int)fVar207 | (uint)!bVar13 * auVar136._8_4_;
              bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
              local_560._12_4_ = (uint)bVar13 * (int)fVar208 | (uint)!bVar13 * auVar136._12_4_;
              bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
              local_560._16_4_ = (uint)bVar13 * (int)fVar153 | (uint)!bVar13 * auVar136._16_4_;
              bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
              local_560._20_4_ = (uint)bVar13 * (int)fVar155 | (uint)!bVar13 * auVar136._20_4_;
              bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
              local_560._24_4_ = (uint)bVar13 * (int)fVar156 | (uint)!bVar13 * auVar136._24_4_;
              bVar13 = SUB81(uVar91 >> 7,0);
              local_560._28_4_ = (uint)bVar13 * auVar116._28_4_ | (uint)!bVar13 * auVar136._28_4_;
              auVar197 = ZEXT3264(auVar128);
            }
          }
        }
        auVar237 = ZEXT3264(local_840);
        auVar174 = ZEXT3264(local_820);
        if (bVar100 != 0) {
          auVar136 = vsubps_avx(ZEXT1632(auVar163),auVar121);
          auVar127 = auVar219._0_32_;
          auVar108 = vfmadd213ps_fma(auVar136,auVar127,auVar121);
          uVar159 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar121._4_4_ = uVar159;
          auVar121._0_4_ = uVar159;
          auVar121._8_4_ = uVar159;
          auVar121._12_4_ = uVar159;
          auVar121._16_4_ = uVar159;
          auVar121._20_4_ = uVar159;
          auVar121._24_4_ = uVar159;
          auVar121._28_4_ = uVar159;
          auVar136 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar108._12_4_ + auVar108._12_4_,
                                                        CONCAT48(auVar108._8_4_ + auVar108._8_4_,
                                                                 CONCAT44(auVar108._4_4_ +
                                                                          auVar108._4_4_,
                                                                          auVar108._0_4_ +
                                                                          auVar108._0_4_)))),
                                     auVar121);
          auVar195 = auVar197._0_32_;
          uVar175 = vcmpps_avx512vl(auVar195,auVar136,6);
          bVar100 = bVar100 & (byte)uVar175;
          if (bVar100 != 0) {
            auVar167._8_4_ = 0xbf800000;
            auVar167._0_8_ = 0xbf800000bf800000;
            auVar167._12_4_ = 0xbf800000;
            auVar167._16_4_ = 0xbf800000;
            auVar167._20_4_ = 0xbf800000;
            auVar167._24_4_ = 0xbf800000;
            auVar167._28_4_ = 0xbf800000;
            auVar37._8_4_ = 0x40000000;
            auVar37._0_8_ = 0x4000000040000000;
            auVar37._12_4_ = 0x40000000;
            auVar37._16_4_ = 0x40000000;
            auVar37._20_4_ = 0x40000000;
            auVar37._24_4_ = 0x40000000;
            auVar37._28_4_ = 0x40000000;
            local_6c0 = vfmadd132ps_avx512vl(local_560,auVar167,auVar37);
            local_560 = local_6c0;
            auVar136 = local_560;
            local_680 = 0;
            local_560 = auVar136;
            if ((pGVar96->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar199 = 1.0 / auVar122._0_4_;
              local_620[0] = fVar199 * (auVar219._0_4_ + 0.0);
              local_620[1] = fVar199 * (auVar219._4_4_ + 1.0);
              local_620[2] = fVar199 * (auVar219._8_4_ + 2.0);
              local_620[3] = fVar199 * (auVar219._12_4_ + 3.0);
              fStack_610 = fVar199 * (auVar219._16_4_ + 4.0);
              fStack_60c = fVar199 * (auVar219._20_4_ + 5.0);
              fStack_608 = fVar199 * (auVar219._24_4_ + 6.0);
              fStack_604 = auVar219._28_4_ + 7.0;
              local_560._0_8_ = local_6c0._0_8_;
              local_560._8_8_ = local_6c0._8_8_;
              local_560._16_8_ = local_6c0._16_8_;
              local_560._24_8_ = local_6c0._24_8_;
              local_600 = local_560._0_8_;
              uStack_5f8 = local_560._8_8_;
              uStack_5f0 = local_560._16_8_;
              uStack_5e8 = local_560._24_8_;
              local_5e0 = auVar195;
              auVar168._8_4_ = 0x7f800000;
              auVar168._0_8_ = 0x7f8000007f800000;
              auVar168._12_4_ = 0x7f800000;
              auVar168._16_4_ = 0x7f800000;
              auVar168._20_4_ = 0x7f800000;
              auVar168._24_4_ = 0x7f800000;
              auVar168._28_4_ = 0x7f800000;
              auVar136 = vblendmps_avx512vl(auVar168,auVar195);
              auVar137._0_4_ =
                   (uint)(bVar100 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar100 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar100 >> 1 & 1);
              auVar137._4_4_ = (uint)bVar13 * auVar136._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar100 >> 2 & 1);
              auVar137._8_4_ = (uint)bVar13 * auVar136._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar100 >> 3 & 1);
              auVar137._12_4_ = (uint)bVar13 * auVar136._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar100 >> 4 & 1);
              auVar137._16_4_ = (uint)bVar13 * auVar136._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar100 >> 5 & 1);
              auVar137._20_4_ = (uint)bVar13 * auVar136._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar100 >> 6 & 1);
              auVar137._24_4_ = (uint)bVar13 * auVar136._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar137._28_4_ =
                   (uint)(bVar100 >> 7) * auVar136._28_4_ | (uint)!(bool)(bVar100 >> 7) * 0x7f800000
              ;
              auVar136 = vshufps_avx(auVar137,auVar137,0xb1);
              auVar136 = vminps_avx(auVar137,auVar136);
              auVar128 = vshufpd_avx(auVar136,auVar136,5);
              auVar136 = vminps_avx(auVar136,auVar128);
              auVar128 = vpermpd_avx2(auVar136,0x4e);
              auVar136 = vminps_avx(auVar136,auVar128);
              uVar175 = vcmpps_avx512vl(auVar137,auVar136,0);
              bVar89 = (byte)uVar175 & bVar100;
              bVar90 = bVar100;
              if (bVar89 != 0) {
                bVar90 = bVar89;
              }
              uVar93 = 0;
              for (uVar92 = (uint)bVar90; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                uVar93 = uVar93 + 1;
              }
              uVar91 = (ulong)uVar93;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar96->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar199 = local_620[uVar91];
                uVar159 = *(undefined4 *)((long)&local_600 + uVar91 * 4);
                fVar206 = 1.0 - fVar199;
                auVar107 = vfnmadd231ss_fma(ZEXT416((uint)(fVar199 * (fVar206 + fVar206))),
                                            ZEXT416((uint)fVar206),ZEXT416((uint)fVar206));
                auVar163 = ZEXT416((uint)fVar199);
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar163,
                                           ZEXT416(0xc0a00000));
                auVar164 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199 * 3.0)),
                                           ZEXT416((uint)(fVar199 + fVar199)),auVar108);
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar163,
                                           ZEXT416(0x40000000));
                auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * -3.0)),
                                           ZEXT416((uint)(fVar206 + fVar206)),auVar108);
                auVar163 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199)),auVar163,
                                           ZEXT416((uint)(fVar206 * -2.0)));
                fVar206 = auVar107._0_4_ * 0.5;
                fVar207 = auVar164._0_4_ * 0.5;
                fVar208 = auVar108._0_4_ * 0.5;
                auVar219 = ZEXT3264(auVar127);
                fVar182 = auVar163._0_4_ * 0.5;
                auVar187._0_4_ = fVar182 * local_8a0;
                auVar187._4_4_ = fVar182 * fStack_89c;
                auVar187._8_4_ = fVar182 * fStack_898;
                auVar187._12_4_ = fVar182 * fStack_894;
                auVar210._4_4_ = fVar208;
                auVar210._0_4_ = fVar208;
                auVar210._8_4_ = fVar208;
                auVar210._12_4_ = fVar208;
                auVar108 = vfmadd132ps_fma(auVar210,auVar187,*pauVar4);
                auVar188._4_4_ = fVar207;
                auVar188._0_4_ = fVar207;
                auVar188._8_4_ = fVar207;
                auVar188._12_4_ = fVar207;
                auVar108 = vfmadd132ps_fma(auVar188,auVar108,*pauVar3);
                auVar180._4_4_ = fVar206;
                auVar180._0_4_ = fVar206;
                auVar180._8_4_ = fVar206;
                auVar180._12_4_ = fVar206;
                auVar108 = vfmadd213ps_fma(auVar180,auVar106,auVar108);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + uVar91 * 4);
                auVar197 = ZEXT3264(auVar195);
                *(int *)(ray + k * 4 + 0x300) = auVar108._0_4_;
                uVar11 = vextractps_avx(auVar108,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar11;
                uVar11 = vextractps_avx(auVar108,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar11;
                *(float *)(ray + k * 4 + 0x3c0) = fVar199;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar159;
                *(uint *)(ray + k * 4 + 0x440) = uVar9;
                *(uint *)(ray + k * 4 + 0x480) = uVar97;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar197 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar197);
                auVar197 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar197);
                local_7a0 = (undefined4)uVar31;
                uStack_79c = (undefined4)((ulong)uVar31 >> 0x20);
                local_7c0 = local_8a0;
                fStack_7bc = fStack_89c;
                fStack_7b8 = fStack_898;
                fStack_7b4 = fStack_894;
                local_7b0 = uVar81;
                uStack_7a8 = uVar82;
                uStack_798 = uVar80;
                local_6e0 = auVar127;
                local_6a0 = auVar195;
                local_67c = iVar10;
                local_670 = auVar106;
                local_660 = uVar31;
                uStack_658 = uVar80;
                local_650 = uVar81;
                uStack_648 = uVar82;
                local_630 = bVar100;
                do {
                  auVar107 = auVar236._0_16_;
                  local_480._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[uVar91]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_600 + uVar91 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + uVar91 * 4);
                  local_8d0.context = context->user;
                  fVar206 = local_200._0_4_;
                  fVar199 = 1.0 - fVar206;
                  auVar163 = vfnmadd231ss_fma(ZEXT416((uint)(fVar206 * (fVar199 + fVar199))),
                                              ZEXT416((uint)fVar199),ZEXT416((uint)fVar199));
                  auVar164 = local_200._0_16_;
                  auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar164,
                                             ZEXT416(0xc0a00000));
                  auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * 3.0)),
                                             ZEXT416((uint)(fVar206 + fVar206)),auVar104);
                  auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar164,
                                             ZEXT416(0x40000000));
                  auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199 * -3.0)),
                                             ZEXT416((uint)(fVar199 + fVar199)),auVar104);
                  auVar164 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),auVar164,
                                             ZEXT416((uint)(fVar199 * -2.0)));
                  fVar199 = auVar163._0_4_ * 0.5;
                  fVar206 = auVar108._0_4_ * 0.5;
                  fVar207 = auVar104._0_4_ * 0.5;
                  fVar208 = auVar164._0_4_ * 0.5;
                  auVar193._0_4_ = fVar208 * local_7c0;
                  auVar193._4_4_ = fVar208 * fStack_7bc;
                  auVar193._8_4_ = fVar208 * fStack_7b8;
                  auVar193._12_4_ = fVar208 * fStack_7b4;
                  auVar213._4_4_ = fVar207;
                  auVar213._0_4_ = fVar207;
                  auVar213._8_4_ = fVar207;
                  auVar213._12_4_ = fVar207;
                  auVar86._8_8_ = uStack_7a8;
                  auVar86._0_8_ = local_7b0;
                  auVar104 = vfmadd132ps_fma(auVar213,auVar193,auVar86);
                  auVar194._4_4_ = fVar206;
                  auVar194._0_4_ = fVar206;
                  auVar194._8_4_ = fVar206;
                  auVar194._12_4_ = fVar206;
                  auVar87._4_4_ = uStack_79c;
                  auVar87._0_4_ = local_7a0;
                  auVar87._8_8_ = uStack_798;
                  auVar104 = vfmadd132ps_fma(auVar194,auVar104,auVar87);
                  auVar166._4_4_ = fVar199;
                  auVar166._0_4_ = fVar199;
                  auVar166._8_4_ = fVar199;
                  auVar166._12_4_ = fVar199;
                  auVar104 = vfmadd213ps_fma(auVar166,auVar106,auVar104);
                  auVar197 = vbroadcastss_avx512f(auVar104);
                  auVar219 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar219,ZEXT1664(auVar104));
                  auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar104));
                  local_2c0[0] = (RTCHitN)auVar197[0];
                  local_2c0[1] = (RTCHitN)auVar197[1];
                  local_2c0[2] = (RTCHitN)auVar197[2];
                  local_2c0[3] = (RTCHitN)auVar197[3];
                  local_2c0[4] = (RTCHitN)auVar197[4];
                  local_2c0[5] = (RTCHitN)auVar197[5];
                  local_2c0[6] = (RTCHitN)auVar197[6];
                  local_2c0[7] = (RTCHitN)auVar197[7];
                  local_2c0[8] = (RTCHitN)auVar197[8];
                  local_2c0[9] = (RTCHitN)auVar197[9];
                  local_2c0[10] = (RTCHitN)auVar197[10];
                  local_2c0[0xb] = (RTCHitN)auVar197[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar197[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar197[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar197[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar197[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar197[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar197[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar197[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar197[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar197[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar197[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar197[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar197[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar197[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar197[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar197[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar197[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar197[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar197[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar197[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar197[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar197[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar197[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar197[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar197[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar197[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar197[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar197[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar197[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar197[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar197[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar197[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar197[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar197[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar197[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar197[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar197[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar197[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar197[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar197[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar197[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar197[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar197[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar197[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar197[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar197[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar197[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar197[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar197[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar197[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar197[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar197[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar197[0x3f];
                  local_180 = local_500._0_8_;
                  uStack_178 = local_500._8_8_;
                  uStack_170 = local_500._16_8_;
                  uStack_168 = local_500._24_8_;
                  uStack_160 = local_500._32_8_;
                  uStack_158 = local_500._40_8_;
                  uStack_150 = local_500._48_8_;
                  uStack_148 = local_500._56_8_;
                  auVar197 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar197);
                  auVar136 = vpcmpeqd_avx2(auVar197._0_32_,auVar197._0_32_);
                  local_888[3] = auVar136;
                  local_888[2] = auVar136;
                  local_888[1] = auVar136;
                  *local_888 = auVar136;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_8d0.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_8d0.context)->instPrimID[0]));
                  local_5c0 = local_300;
                  local_8d0.valid = (int *)local_5c0;
                  local_8d0.geometryUserPtr = pGVar96->userPtr;
                  local_8d0.hit = local_2c0;
                  local_8d0.N = 0x10;
                  local_720 = (uint)uVar91;
                  uStack_71c = (uint)(uVar91 >> 0x20);
                  local_8d0.ray = (RTCRayN *)ray;
                  if (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar96->intersectionFilterN)(&local_8d0);
                    uVar91 = CONCAT44(uStack_71c,local_720);
                    auVar238 = ZEXT1664(local_740._0_16_);
                    auVar237 = ZEXT3264(local_840);
                    auVar174 = ZEXT3264(local_820);
                    auVar233 = ZEXT3264(local_880);
                    auVar234 = ZEXT3264(local_860);
                    auVar235 = ZEXT3264(local_760);
                    in_ZMM21 = ZEXT3264(local_800);
                    in_ZMM20 = ZEXT3264(local_7e0);
                    auVar104 = vxorps_avx512vl(auVar107,auVar107);
                    auVar236 = ZEXT1664(auVar104);
                    uVar95 = local_780._0_4_;
                  }
                  auVar104 = auVar236._0_16_;
                  auVar197 = vmovdqa64_avx512f(local_5c0);
                  uVar175 = vptestmd_avx512f(auVar197,auVar197);
                  if ((short)uVar175 == 0) {
LAB_01b6c7ca:
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_480._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar96->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_8d0);
                      uVar91 = CONCAT44(uStack_71c,local_720);
                      auVar238 = ZEXT1664(local_740._0_16_);
                      auVar237 = ZEXT3264(local_840);
                      auVar174 = ZEXT3264(local_820);
                      auVar233 = ZEXT3264(local_880);
                      auVar234 = ZEXT3264(local_860);
                      auVar235 = ZEXT3264(local_760);
                      in_ZMM21 = ZEXT3264(local_800);
                      in_ZMM20 = ZEXT3264(local_7e0);
                      auVar104 = vxorps_avx512vl(auVar104,auVar104);
                      auVar236 = ZEXT1664(auVar104);
                      uVar95 = local_780._0_4_;
                    }
                    auVar197 = vmovdqa64_avx512f(local_5c0);
                    uVar94 = vptestmd_avx512f(auVar197,auVar197);
                    if ((short)uVar94 == 0) goto LAB_01b6c7ca;
                    iVar1 = *(int *)(local_8d0.hit + 4);
                    iVar2 = *(int *)(local_8d0.hit + 8);
                    iVar67 = *(int *)(local_8d0.hit + 0xc);
                    iVar68 = *(int *)(local_8d0.hit + 0x10);
                    iVar69 = *(int *)(local_8d0.hit + 0x14);
                    iVar70 = *(int *)(local_8d0.hit + 0x18);
                    iVar71 = *(int *)(local_8d0.hit + 0x1c);
                    iVar72 = *(int *)(local_8d0.hit + 0x20);
                    iVar73 = *(int *)(local_8d0.hit + 0x24);
                    iVar74 = *(int *)(local_8d0.hit + 0x28);
                    iVar75 = *(int *)(local_8d0.hit + 0x2c);
                    iVar76 = *(int *)(local_8d0.hit + 0x30);
                    iVar77 = *(int *)(local_8d0.hit + 0x34);
                    iVar78 = *(int *)(local_8d0.hit + 0x38);
                    iVar79 = *(int *)(local_8d0.hit + 0x3c);
                    bVar90 = (byte)uVar94;
                    bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                    bVar89 = (byte)(uVar94 >> 8);
                    bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                    bVar26 = SUB81(uVar94 >> 0xf,0);
                    *(uint *)(local_8d0.ray + 0x300) =
                         (uint)(bVar90 & 1) * *(int *)local_8d0.hit |
                         (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x300);
                    *(uint *)(local_8d0.ray + 0x304) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x304);
                    *(uint *)(local_8d0.ray + 0x308) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x308);
                    *(uint *)(local_8d0.ray + 0x30c) =
                         (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x30c);
                    *(uint *)(local_8d0.ray + 0x310) =
                         (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x310);
                    *(uint *)(local_8d0.ray + 0x314) =
                         (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x314);
                    *(uint *)(local_8d0.ray + 0x318) =
                         (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x318);
                    *(uint *)(local_8d0.ray + 0x31c) =
                         (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x31c);
                    *(uint *)(local_8d0.ray + 800) =
                         (uint)(bVar89 & 1) * iVar72 |
                         (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 800);
                    *(uint *)(local_8d0.ray + 0x324) =
                         (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x324);
                    *(uint *)(local_8d0.ray + 0x328) =
                         (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 0x328);
                    *(uint *)(local_8d0.ray + 0x32c) =
                         (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x32c);
                    *(uint *)(local_8d0.ray + 0x330) =
                         (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x330);
                    *(uint *)(local_8d0.ray + 0x334) =
                         (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x334);
                    *(uint *)(local_8d0.ray + 0x338) =
                         (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x338);
                    *(uint *)(local_8d0.ray + 0x33c) =
                         (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x33c);
                    iVar1 = *(int *)(local_8d0.hit + 0x44);
                    iVar2 = *(int *)(local_8d0.hit + 0x48);
                    iVar67 = *(int *)(local_8d0.hit + 0x4c);
                    iVar68 = *(int *)(local_8d0.hit + 0x50);
                    iVar69 = *(int *)(local_8d0.hit + 0x54);
                    iVar70 = *(int *)(local_8d0.hit + 0x58);
                    iVar71 = *(int *)(local_8d0.hit + 0x5c);
                    iVar72 = *(int *)(local_8d0.hit + 0x60);
                    iVar73 = *(int *)(local_8d0.hit + 100);
                    iVar74 = *(int *)(local_8d0.hit + 0x68);
                    iVar75 = *(int *)(local_8d0.hit + 0x6c);
                    iVar76 = *(int *)(local_8d0.hit + 0x70);
                    iVar77 = *(int *)(local_8d0.hit + 0x74);
                    iVar78 = *(int *)(local_8d0.hit + 0x78);
                    iVar79 = *(int *)(local_8d0.hit + 0x7c);
                    bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                    bVar26 = SUB81(uVar94 >> 0xf,0);
                    *(uint *)(local_8d0.ray + 0x340) =
                         (uint)(bVar90 & 1) * *(int *)(local_8d0.hit + 0x40) |
                         (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x340);
                    *(uint *)(local_8d0.ray + 0x344) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x344);
                    *(uint *)(local_8d0.ray + 0x348) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x348);
                    *(uint *)(local_8d0.ray + 0x34c) =
                         (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x34c);
                    *(uint *)(local_8d0.ray + 0x350) =
                         (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x350);
                    *(uint *)(local_8d0.ray + 0x354) =
                         (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x354);
                    *(uint *)(local_8d0.ray + 0x358) =
                         (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x358);
                    *(uint *)(local_8d0.ray + 0x35c) =
                         (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x35c);
                    *(uint *)(local_8d0.ray + 0x360) =
                         (uint)(bVar89 & 1) * iVar72 |
                         (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 0x360);
                    *(uint *)(local_8d0.ray + 0x364) =
                         (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x364);
                    *(uint *)(local_8d0.ray + 0x368) =
                         (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 0x368);
                    *(uint *)(local_8d0.ray + 0x36c) =
                         (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x36c);
                    *(uint *)(local_8d0.ray + 0x370) =
                         (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x370);
                    *(uint *)(local_8d0.ray + 0x374) =
                         (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x374);
                    *(uint *)(local_8d0.ray + 0x378) =
                         (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x378);
                    *(uint *)(local_8d0.ray + 0x37c) =
                         (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x37c);
                    iVar1 = *(int *)(local_8d0.hit + 0x84);
                    iVar2 = *(int *)(local_8d0.hit + 0x88);
                    iVar67 = *(int *)(local_8d0.hit + 0x8c);
                    iVar68 = *(int *)(local_8d0.hit + 0x90);
                    iVar69 = *(int *)(local_8d0.hit + 0x94);
                    iVar70 = *(int *)(local_8d0.hit + 0x98);
                    iVar71 = *(int *)(local_8d0.hit + 0x9c);
                    iVar72 = *(int *)(local_8d0.hit + 0xa0);
                    iVar73 = *(int *)(local_8d0.hit + 0xa4);
                    iVar74 = *(int *)(local_8d0.hit + 0xa8);
                    iVar75 = *(int *)(local_8d0.hit + 0xac);
                    iVar76 = *(int *)(local_8d0.hit + 0xb0);
                    iVar77 = *(int *)(local_8d0.hit + 0xb4);
                    iVar78 = *(int *)(local_8d0.hit + 0xb8);
                    iVar79 = *(int *)(local_8d0.hit + 0xbc);
                    bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                    bVar26 = SUB81(uVar94 >> 0xf,0);
                    *(uint *)(local_8d0.ray + 0x380) =
                         (uint)(bVar90 & 1) * *(int *)(local_8d0.hit + 0x80) |
                         (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x380);
                    *(uint *)(local_8d0.ray + 900) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 900);
                    *(uint *)(local_8d0.ray + 0x388) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x388);
                    *(uint *)(local_8d0.ray + 0x38c) =
                         (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x38c);
                    *(uint *)(local_8d0.ray + 0x390) =
                         (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x390);
                    *(uint *)(local_8d0.ray + 0x394) =
                         (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x394);
                    *(uint *)(local_8d0.ray + 0x398) =
                         (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x398);
                    *(uint *)(local_8d0.ray + 0x39c) =
                         (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x39c);
                    *(uint *)(local_8d0.ray + 0x3a0) =
                         (uint)(bVar89 & 1) * iVar72 |
                         (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 0x3a0);
                    *(uint *)(local_8d0.ray + 0x3a4) =
                         (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x3a4);
                    *(uint *)(local_8d0.ray + 0x3a8) =
                         (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 0x3a8);
                    *(uint *)(local_8d0.ray + 0x3ac) =
                         (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x3ac);
                    *(uint *)(local_8d0.ray + 0x3b0) =
                         (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x3b0);
                    *(uint *)(local_8d0.ray + 0x3b4) =
                         (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x3b4);
                    *(uint *)(local_8d0.ray + 0x3b8) =
                         (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x3b8);
                    *(uint *)(local_8d0.ray + 0x3bc) =
                         (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x3bc);
                    iVar1 = *(int *)(local_8d0.hit + 0xc4);
                    iVar2 = *(int *)(local_8d0.hit + 200);
                    iVar67 = *(int *)(local_8d0.hit + 0xcc);
                    iVar68 = *(int *)(local_8d0.hit + 0xd0);
                    iVar69 = *(int *)(local_8d0.hit + 0xd4);
                    iVar70 = *(int *)(local_8d0.hit + 0xd8);
                    iVar71 = *(int *)(local_8d0.hit + 0xdc);
                    iVar72 = *(int *)(local_8d0.hit + 0xe0);
                    iVar73 = *(int *)(local_8d0.hit + 0xe4);
                    iVar74 = *(int *)(local_8d0.hit + 0xe8);
                    iVar75 = *(int *)(local_8d0.hit + 0xec);
                    iVar76 = *(int *)(local_8d0.hit + 0xf0);
                    iVar77 = *(int *)(local_8d0.hit + 0xf4);
                    iVar78 = *(int *)(local_8d0.hit + 0xf8);
                    iVar79 = *(int *)(local_8d0.hit + 0xfc);
                    bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                    bVar26 = SUB81(uVar94 >> 0xf,0);
                    *(uint *)(local_8d0.ray + 0x3c0) =
                         (uint)(bVar90 & 1) * *(int *)(local_8d0.hit + 0xc0) |
                         (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x3c0);
                    *(uint *)(local_8d0.ray + 0x3c4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x3c4);
                    *(uint *)(local_8d0.ray + 0x3c8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x3c8);
                    *(uint *)(local_8d0.ray + 0x3cc) =
                         (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x3cc);
                    *(uint *)(local_8d0.ray + 0x3d0) =
                         (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x3d0);
                    *(uint *)(local_8d0.ray + 0x3d4) =
                         (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x3d4);
                    *(uint *)(local_8d0.ray + 0x3d8) =
                         (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x3d8);
                    *(uint *)(local_8d0.ray + 0x3dc) =
                         (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x3dc);
                    *(uint *)(local_8d0.ray + 0x3e0) =
                         (uint)(bVar89 & 1) * iVar72 |
                         (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 0x3e0);
                    *(uint *)(local_8d0.ray + 0x3e4) =
                         (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x3e4);
                    *(uint *)(local_8d0.ray + 1000) =
                         (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 1000);
                    *(uint *)(local_8d0.ray + 0x3ec) =
                         (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x3ec);
                    *(uint *)(local_8d0.ray + 0x3f0) =
                         (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x3f0);
                    *(uint *)(local_8d0.ray + 0x3f4) =
                         (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x3f4);
                    *(uint *)(local_8d0.ray + 0x3f8) =
                         (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x3f8);
                    *(uint *)(local_8d0.ray + 0x3fc) =
                         (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x3fc);
                    iVar1 = *(int *)(local_8d0.hit + 0x104);
                    iVar2 = *(int *)(local_8d0.hit + 0x108);
                    iVar67 = *(int *)(local_8d0.hit + 0x10c);
                    iVar68 = *(int *)(local_8d0.hit + 0x110);
                    iVar69 = *(int *)(local_8d0.hit + 0x114);
                    iVar70 = *(int *)(local_8d0.hit + 0x118);
                    iVar71 = *(int *)(local_8d0.hit + 0x11c);
                    iVar72 = *(int *)(local_8d0.hit + 0x120);
                    iVar73 = *(int *)(local_8d0.hit + 0x124);
                    iVar74 = *(int *)(local_8d0.hit + 0x128);
                    iVar75 = *(int *)(local_8d0.hit + 300);
                    iVar76 = *(int *)(local_8d0.hit + 0x130);
                    iVar77 = *(int *)(local_8d0.hit + 0x134);
                    iVar78 = *(int *)(local_8d0.hit + 0x138);
                    iVar79 = *(int *)(local_8d0.hit + 0x13c);
                    bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                    bVar26 = SUB81(uVar94 >> 0xf,0);
                    *(uint *)(local_8d0.ray + 0x400) =
                         (uint)(bVar90 & 1) * *(int *)(local_8d0.hit + 0x100) |
                         (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x400);
                    *(uint *)(local_8d0.ray + 0x404) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x404);
                    *(uint *)(local_8d0.ray + 0x408) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x408);
                    *(uint *)(local_8d0.ray + 0x40c) =
                         (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x40c);
                    *(uint *)(local_8d0.ray + 0x410) =
                         (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x410);
                    *(uint *)(local_8d0.ray + 0x414) =
                         (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x414);
                    *(uint *)(local_8d0.ray + 0x418) =
                         (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x418);
                    *(uint *)(local_8d0.ray + 0x41c) =
                         (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x41c);
                    *(uint *)(local_8d0.ray + 0x420) =
                         (uint)(bVar89 & 1) * iVar72 |
                         (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 0x420);
                    *(uint *)(local_8d0.ray + 0x424) =
                         (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x424);
                    *(uint *)(local_8d0.ray + 0x428) =
                         (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 0x428);
                    *(uint *)(local_8d0.ray + 0x42c) =
                         (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x42c);
                    *(uint *)(local_8d0.ray + 0x430) =
                         (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x430);
                    *(uint *)(local_8d0.ray + 0x434) =
                         (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x434);
                    *(uint *)(local_8d0.ray + 0x438) =
                         (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x438);
                    *(uint *)(local_8d0.ray + 0x43c) =
                         (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x43c);
                    auVar197 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_8d0.hit + 0x140));
                    auVar197 = vmovdqu32_avx512f(auVar197);
                    *(undefined1 (*) [64])(local_8d0.ray + 0x440) = auVar197;
                    auVar197 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_8d0.hit + 0x180));
                    auVar197 = vmovdqu32_avx512f(auVar197);
                    *(undefined1 (*) [64])(local_8d0.ray + 0x480) = auVar197;
                    auVar197 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_8d0.hit + 0x1c0));
                    auVar197 = vmovdqa32_avx512f(auVar197);
                    *(undefined1 (*) [64])(local_8d0.ray + 0x4c0) = auVar197;
                    auVar197 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_8d0.hit + 0x200));
                    auVar197 = vmovdqa32_avx512f(auVar197);
                    *(undefined1 (*) [64])(local_8d0.ray + 0x500) = auVar197;
                  }
                  auVar104 = auVar238._0_16_;
                  auVar219 = ZEXT3264(auVar127);
                  auVar197 = ZEXT3264(auVar195);
                  bVar90 = ~(byte)(1 << ((uint)uVar91 & 0x1f)) & bVar100;
                  uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar43._4_4_ = uVar159;
                  auVar43._0_4_ = uVar159;
                  auVar43._8_4_ = uVar159;
                  auVar43._12_4_ = uVar159;
                  auVar43._16_4_ = uVar159;
                  auVar43._20_4_ = uVar159;
                  auVar43._24_4_ = uVar159;
                  auVar43._28_4_ = uVar159;
                  uVar175 = vcmpps_avx512vl(auVar195,auVar43,2);
                  bVar100 = bVar90 & (byte)uVar175;
                  if ((bVar90 & (byte)uVar175) != 0) {
                    auVar173._8_4_ = 0x7f800000;
                    auVar173._0_8_ = 0x7f8000007f800000;
                    auVar173._12_4_ = 0x7f800000;
                    auVar173._16_4_ = 0x7f800000;
                    auVar173._20_4_ = 0x7f800000;
                    auVar173._24_4_ = 0x7f800000;
                    auVar173._28_4_ = 0x7f800000;
                    auVar136 = vblendmps_avx512vl(auVar173,auVar195);
                    auVar149._0_4_ =
                         (uint)(bVar100 & 1) * auVar136._0_4_ |
                         (uint)!(bool)(bVar100 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar100 >> 1 & 1);
                    auVar149._4_4_ = (uint)bVar13 * auVar136._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar100 >> 2 & 1);
                    auVar149._8_4_ = (uint)bVar13 * auVar136._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar100 >> 3 & 1);
                    auVar149._12_4_ = (uint)bVar13 * auVar136._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar100 >> 4 & 1);
                    auVar149._16_4_ = (uint)bVar13 * auVar136._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar100 >> 5 & 1);
                    auVar149._20_4_ = (uint)bVar13 * auVar136._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar100 >> 6 & 1);
                    auVar149._24_4_ = (uint)bVar13 * auVar136._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar149._28_4_ =
                         (uint)(bVar100 >> 7) * auVar136._28_4_ |
                         (uint)!(bool)(bVar100 >> 7) * 0x7f800000;
                    auVar136 = vshufps_avx(auVar149,auVar149,0xb1);
                    auVar136 = vminps_avx(auVar149,auVar136);
                    auVar128 = vshufpd_avx(auVar136,auVar136,5);
                    auVar136 = vminps_avx(auVar136,auVar128);
                    auVar128 = vpermpd_avx2(auVar136,0x4e);
                    auVar136 = vminps_avx(auVar136,auVar128);
                    uVar175 = vcmpps_avx512vl(auVar149,auVar136,0);
                    bVar89 = (byte)uVar175 & bVar100;
                    bVar90 = bVar100;
                    if (bVar89 != 0) {
                      bVar90 = bVar89;
                    }
                    uVar93 = 0;
                    for (uVar92 = (uint)bVar90; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000
                        ) {
                      uVar93 = uVar93 + 1;
                    }
                    uVar91 = (ulong)uVar93;
                  }
                } while (bVar100 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar10) {
        local_740 = vpbroadcastd_avx512vl();
        local_780 = vbroadcastss_avx512vl(auVar104);
        fStack_6f0 = 1.0 / local_700;
        auStack_6fc._0_4_ = fStack_6f0;
        local_700 = fStack_6f0;
        auStack_6fc._4_4_ = fStack_6f0;
        fStack_6f4 = fStack_6f0;
        auVar238 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar238);
        auVar238 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar238);
        lVar98 = 8;
        auVar195 = auVar219._0_32_;
        auVar136 = auVar197._0_32_;
        local_720 = uVar95;
        uStack_71c = uVar95;
        uStack_718 = uVar95;
        uStack_714 = uVar95;
        uStack_710 = uVar95;
        uStack_70c = uVar95;
        uStack_708 = uVar95;
        uStack_704 = uVar95;
        fStack_6ec = fStack_6f0;
        fStack_6e8 = fStack_6f0;
        fStack_6e4 = fStack_6f0;
        do {
          auVar127 = vpbroadcastd_avx512vl();
          auVar111 = vpor_avx2(auVar127,_DAT_0205a920);
          uVar32 = vpcmpd_avx512vl(auVar111,local_740,1);
          auVar127 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar98 * 4 + lVar33);
          auVar128 = *(undefined1 (*) [32])(lVar33 + 0x22307f0 + lVar98 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar33 + 0x2230c74 + lVar98 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar33 + 0x22310f8 + lVar98 * 4);
          local_820 = auVar174._0_32_;
          auVar112 = vmulps_avx512vl(local_820,auVar125);
          local_840 = auVar237._0_32_;
          auVar113 = vmulps_avx512vl(local_840,auVar125);
          auVar48._4_4_ = auVar125._4_4_ * (float)local_3c0._4_4_;
          auVar48._0_4_ = auVar125._0_4_ * (float)local_3c0._0_4_;
          auVar48._8_4_ = auVar125._8_4_ * fStack_3b8;
          auVar48._12_4_ = auVar125._12_4_ * fStack_3b4;
          auVar48._16_4_ = auVar125._16_4_ * fStack_3b0;
          auVar48._20_4_ = auVar125._20_4_ * fStack_3ac;
          auVar48._24_4_ = auVar125._24_4_ * fStack_3a8;
          auVar48._28_4_ = auVar111._28_4_;
          auVar111 = vfmadd231ps_avx512vl(auVar112,auVar126,local_360);
          auVar112 = vfmadd231ps_avx512vl(auVar113,auVar126,local_380);
          auVar113 = vfmadd231ps_avx512vl(auVar48,auVar126,local_3a0);
          auVar123 = auVar233._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar128,auVar123);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar128,local_520);
          auVar104 = vfmadd231ps_fma(auVar113,auVar128,local_340);
          auVar130 = auVar235._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar111,auVar127,auVar130);
          auVar129 = auVar234._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar112,auVar127,auVar129);
          auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar98 * 4 + lVar33);
          auVar112 = *(undefined1 (*) [32])(lVar33 + 0x2232c10 + lVar98 * 4);
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar127,local_320);
          auVar113 = *(undefined1 (*) [32])(lVar33 + 0x2233094 + lVar98 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar33 + 0x2233518 + lVar98 * 4);
          auVar114 = vmulps_avx512vl(local_820,auVar124);
          auVar115 = vmulps_avx512vl(local_840,auVar124);
          auVar49._4_4_ = auVar124._4_4_ * (float)local_3c0._4_4_;
          auVar49._0_4_ = auVar124._0_4_ * (float)local_3c0._0_4_;
          auVar49._8_4_ = auVar124._8_4_ * fStack_3b8;
          auVar49._12_4_ = auVar124._12_4_ * fStack_3b4;
          auVar49._16_4_ = auVar124._16_4_ * fStack_3b0;
          auVar49._20_4_ = auVar124._20_4_ * fStack_3ac;
          auVar49._24_4_ = auVar124._24_4_ * fStack_3a8;
          auVar49._28_4_ = uStack_3a4;
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar113,local_360);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,local_380);
          auVar118 = vfmadd231ps_avx512vl(auVar49,auVar113,local_3a0);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar112,auVar123);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,local_520);
          auVar108 = vfmadd231ps_fma(auVar118,auVar112,local_340);
          auVar118 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar130);
          auVar119 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar129);
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar111,local_320);
          auVar120 = vmaxps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar108));
          auVar114 = vsubps_avx(auVar118,auVar116);
          auVar115 = vsubps_avx(auVar119,auVar117);
          auVar121 = vmulps_avx512vl(auVar117,auVar114);
          auVar122 = vmulps_avx512vl(auVar116,auVar115);
          auVar121 = vsubps_avx512vl(auVar121,auVar122);
          auVar122 = vmulps_avx512vl(auVar115,auVar115);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar114,auVar114);
          auVar120 = vmulps_avx512vl(auVar120,auVar120);
          auVar120 = vmulps_avx512vl(auVar120,auVar122);
          auVar121 = vmulps_avx512vl(auVar121,auVar121);
          uVar175 = vcmpps_avx512vl(auVar121,auVar120,2);
          local_630 = (byte)uVar32 & (byte)uVar175;
          if (local_630 == 0) {
            auVar234 = ZEXT3264(auVar129);
            auVar233 = ZEXT3264(auVar123);
          }
          else {
            auVar124 = vmulps_avx512vl(local_440,auVar124);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_420,auVar124);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_400,auVar113);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_3e0,auVar112);
            auVar125 = vmulps_avx512vl(local_440,auVar125);
            auVar126 = vfmadd213ps_avx512vl(auVar126,local_420,auVar125);
            auVar128 = vfmadd213ps_avx512vl(auVar128,local_400,auVar126);
            auVar112 = vfmadd213ps_avx512vl(auVar127,local_3e0,auVar128);
            auVar127 = *(undefined1 (*) [32])(lVar33 + 0x223157c + lVar98 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar33 + 0x2231a00 + lVar98 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar33 + 0x2231e84 + lVar98 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar33 + 0x2232308 + lVar98 * 4);
            auVar113 = vmulps_avx512vl(local_820,auVar125);
            auVar124 = vmulps_avx512vl(local_840,auVar125);
            auVar125 = vmulps_avx512vl(local_440,auVar125);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar126,local_360);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar126,local_380);
            auVar126 = vfmadd231ps_avx512vl(auVar125,local_420,auVar126);
            auVar125 = vfmadd231ps_avx512vl(auVar113,auVar128,auVar123);
            auVar113 = vfmadd231ps_avx512vl(auVar124,auVar128,local_520);
            auVar128 = vfmadd231ps_avx512vl(auVar126,local_400,auVar128);
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar127,auVar130);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar127,auVar129);
            auVar124 = vfmadd231ps_avx512vl(auVar128,local_3e0,auVar127);
            auVar127 = *(undefined1 (*) [32])(lVar33 + 0x223399c + lVar98 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar33 + 0x22342a4 + lVar98 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar33 + 0x2234728 + lVar98 * 4);
            auVar120 = vmulps_avx512vl(local_820,auVar126);
            auVar121 = vmulps_avx512vl(local_840,auVar126);
            auVar126 = vmulps_avx512vl(local_440,auVar126);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar128,local_360);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar128,local_380);
            auVar126 = vfmadd231ps_avx512vl(auVar126,local_420,auVar128);
            auVar128 = *(undefined1 (*) [32])(lVar33 + 0x2233e20 + lVar98 * 4);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar128,auVar123);
            auVar164 = vfmadd231ps_fma(auVar121,auVar128,local_520);
            auVar128 = vfmadd231ps_avx512vl(auVar126,local_400,auVar128);
            auVar126 = vfmadd231ps_avx512vl(auVar120,auVar127,auVar130);
            auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar164),auVar127,auVar129);
            auVar128 = vfmadd231ps_avx512vl(auVar128,local_3e0,auVar127);
            auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar125,auVar121);
            vandps_avx512vl(auVar113,auVar121);
            auVar127 = vmaxps_avx(auVar121,auVar121);
            vandps_avx512vl(auVar124,auVar121);
            auVar127 = vmaxps_avx(auVar127,auVar121);
            uVar91 = vcmpps_avx512vl(auVar127,local_780,1);
            bVar13 = (bool)((byte)uVar91 & 1);
            auVar138._0_4_ = (float)((uint)bVar13 * auVar114._0_4_ | (uint)!bVar13 * auVar125._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar125._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar125._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar125._12_4_);
            bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
            auVar138._16_4_ =
                 (float)((uint)bVar13 * auVar114._16_4_ | (uint)!bVar13 * auVar125._16_4_);
            bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
            auVar138._20_4_ =
                 (float)((uint)bVar13 * auVar114._20_4_ | (uint)!bVar13 * auVar125._20_4_);
            bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
            auVar138._24_4_ =
                 (float)((uint)bVar13 * auVar114._24_4_ | (uint)!bVar13 * auVar125._24_4_);
            bVar13 = SUB81(uVar91 >> 7,0);
            auVar138._28_4_ = (uint)bVar13 * auVar114._28_4_ | (uint)!bVar13 * auVar125._28_4_;
            bVar13 = (bool)((byte)uVar91 & 1);
            auVar139._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar113._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar113._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar113._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar113._12_4_);
            bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
            auVar139._16_4_ =
                 (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar113._16_4_);
            bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
            auVar139._20_4_ =
                 (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar113._20_4_);
            bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
            auVar139._24_4_ =
                 (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar113._24_4_);
            bVar13 = SUB81(uVar91 >> 7,0);
            auVar139._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar113._28_4_;
            vandps_avx512vl(auVar126,auVar121);
            vandps_avx512vl(auVar120,auVar121);
            auVar127 = vmaxps_avx(auVar139,auVar139);
            vandps_avx512vl(auVar128,auVar121);
            auVar127 = vmaxps_avx(auVar127,auVar139);
            uVar91 = vcmpps_avx512vl(auVar127,local_780,1);
            bVar13 = (bool)((byte)uVar91 & 1);
            auVar140._0_4_ = (uint)bVar13 * auVar114._0_4_ | (uint)!bVar13 * auVar126._0_4_;
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar126._4_4_;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar126._8_4_;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar126._12_4_;
            bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
            auVar140._16_4_ = (uint)bVar13 * auVar114._16_4_ | (uint)!bVar13 * auVar126._16_4_;
            bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
            auVar140._20_4_ = (uint)bVar13 * auVar114._20_4_ | (uint)!bVar13 * auVar126._20_4_;
            bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
            auVar140._24_4_ = (uint)bVar13 * auVar114._24_4_ | (uint)!bVar13 * auVar126._24_4_;
            bVar13 = SUB81(uVar91 >> 7,0);
            auVar140._28_4_ = (uint)bVar13 * auVar114._28_4_ | (uint)!bVar13 * auVar126._28_4_;
            bVar13 = (bool)((byte)uVar91 & 1);
            auVar141._0_4_ = (float)((uint)bVar13 * auVar115._0_4_ | (uint)!bVar13 * auVar120._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar141._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar120._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar141._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar120._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar141._12_4_ =
                 (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar120._12_4_);
            bVar13 = (bool)((byte)(uVar91 >> 4) & 1);
            auVar141._16_4_ =
                 (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar120._16_4_);
            bVar13 = (bool)((byte)(uVar91 >> 5) & 1);
            auVar141._20_4_ =
                 (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar120._20_4_);
            bVar13 = (bool)((byte)(uVar91 >> 6) & 1);
            auVar141._24_4_ =
                 (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar120._24_4_);
            bVar13 = SUB81(uVar91 >> 7,0);
            auVar141._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar120._28_4_;
            auVar225._8_4_ = 0x80000000;
            auVar225._0_8_ = 0x8000000080000000;
            auVar225._12_4_ = 0x80000000;
            auVar225._16_4_ = 0x80000000;
            auVar225._20_4_ = 0x80000000;
            auVar225._24_4_ = 0x80000000;
            auVar225._28_4_ = 0x80000000;
            auVar127 = vxorps_avx512vl(auVar140,auVar225);
            auVar120 = auVar236._0_32_;
            auVar128 = vfmadd213ps_avx512vl(auVar138,auVar138,auVar120);
            auVar164 = vfmadd231ps_fma(auVar128,auVar139,auVar139);
            auVar128 = vrsqrt14ps_avx512vl(ZEXT1632(auVar164));
            auVar232._8_4_ = 0xbf000000;
            auVar232._0_8_ = 0xbf000000bf000000;
            auVar232._12_4_ = 0xbf000000;
            auVar232._16_4_ = 0xbf000000;
            auVar232._20_4_ = 0xbf000000;
            auVar232._24_4_ = 0xbf000000;
            auVar232._28_4_ = 0xbf000000;
            fVar199 = auVar128._0_4_;
            fVar206 = auVar128._4_4_;
            fVar207 = auVar128._8_4_;
            fVar208 = auVar128._12_4_;
            fVar182 = auVar128._16_4_;
            fVar198 = auVar128._20_4_;
            fVar101 = auVar128._24_4_;
            auVar50._4_4_ = fVar206 * fVar206 * fVar206 * auVar164._4_4_ * -0.5;
            auVar50._0_4_ = fVar199 * fVar199 * fVar199 * auVar164._0_4_ * -0.5;
            auVar50._8_4_ = fVar207 * fVar207 * fVar207 * auVar164._8_4_ * -0.5;
            auVar50._12_4_ = fVar208 * fVar208 * fVar208 * auVar164._12_4_ * -0.5;
            auVar50._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar50._20_4_ = fVar198 * fVar198 * fVar198 * -0.0;
            auVar50._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
            auVar50._28_4_ = auVar139._28_4_;
            auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar128 = vfmadd231ps_avx512vl(auVar50,auVar126,auVar128);
            auVar51._4_4_ = auVar139._4_4_ * auVar128._4_4_;
            auVar51._0_4_ = auVar139._0_4_ * auVar128._0_4_;
            auVar51._8_4_ = auVar139._8_4_ * auVar128._8_4_;
            auVar51._12_4_ = auVar139._12_4_ * auVar128._12_4_;
            auVar51._16_4_ = auVar139._16_4_ * auVar128._16_4_;
            auVar51._20_4_ = auVar139._20_4_ * auVar128._20_4_;
            auVar51._24_4_ = auVar139._24_4_ * auVar128._24_4_;
            auVar51._28_4_ = 0;
            auVar52._4_4_ = auVar128._4_4_ * -auVar138._4_4_;
            auVar52._0_4_ = auVar128._0_4_ * -auVar138._0_4_;
            auVar52._8_4_ = auVar128._8_4_ * -auVar138._8_4_;
            auVar52._12_4_ = auVar128._12_4_ * -auVar138._12_4_;
            auVar52._16_4_ = auVar128._16_4_ * -auVar138._16_4_;
            auVar52._20_4_ = auVar128._20_4_ * -auVar138._20_4_;
            auVar52._24_4_ = auVar128._24_4_ * -auVar138._24_4_;
            auVar52._28_4_ = auVar139._28_4_;
            auVar125 = vmulps_avx512vl(auVar128,auVar120);
            auVar128 = vfmadd213ps_avx512vl(auVar140,auVar140,auVar120);
            auVar128 = vfmadd231ps_avx512vl(auVar128,auVar141,auVar141);
            auVar113 = vrsqrt14ps_avx512vl(auVar128);
            auVar128 = vmulps_avx512vl(auVar128,auVar232);
            fVar199 = auVar113._0_4_;
            fVar206 = auVar113._4_4_;
            fVar207 = auVar113._8_4_;
            fVar208 = auVar113._12_4_;
            fVar182 = auVar113._16_4_;
            fVar198 = auVar113._20_4_;
            fVar101 = auVar113._24_4_;
            auVar53._4_4_ = fVar206 * fVar206 * fVar206 * auVar128._4_4_;
            auVar53._0_4_ = fVar199 * fVar199 * fVar199 * auVar128._0_4_;
            auVar53._8_4_ = fVar207 * fVar207 * fVar207 * auVar128._8_4_;
            auVar53._12_4_ = fVar208 * fVar208 * fVar208 * auVar128._12_4_;
            auVar53._16_4_ = fVar182 * fVar182 * fVar182 * auVar128._16_4_;
            auVar53._20_4_ = fVar198 * fVar198 * fVar198 * auVar128._20_4_;
            auVar53._24_4_ = fVar101 * fVar101 * fVar101 * auVar128._24_4_;
            auVar53._28_4_ = auVar128._28_4_;
            auVar128 = vfmadd231ps_avx512vl(auVar53,auVar126,auVar113);
            auVar54._4_4_ = auVar141._4_4_ * auVar128._4_4_;
            auVar54._0_4_ = auVar141._0_4_ * auVar128._0_4_;
            auVar54._8_4_ = auVar141._8_4_ * auVar128._8_4_;
            auVar54._12_4_ = auVar141._12_4_ * auVar128._12_4_;
            auVar54._16_4_ = auVar141._16_4_ * auVar128._16_4_;
            auVar54._20_4_ = auVar141._20_4_ * auVar128._20_4_;
            auVar54._24_4_ = auVar141._24_4_ * auVar128._24_4_;
            auVar54._28_4_ = auVar113._28_4_;
            auVar55._4_4_ = auVar128._4_4_ * auVar127._4_4_;
            auVar55._0_4_ = auVar128._0_4_ * auVar127._0_4_;
            auVar55._8_4_ = auVar128._8_4_ * auVar127._8_4_;
            auVar55._12_4_ = auVar128._12_4_ * auVar127._12_4_;
            auVar55._16_4_ = auVar128._16_4_ * auVar127._16_4_;
            auVar55._20_4_ = auVar128._20_4_ * auVar127._20_4_;
            auVar55._24_4_ = auVar128._24_4_ * auVar127._24_4_;
            auVar55._28_4_ = auVar127._28_4_;
            auVar127 = vmulps_avx512vl(auVar128,auVar120);
            auVar164 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar104),auVar116);
            auVar128 = ZEXT1632(auVar104);
            auVar163 = vfmadd213ps_fma(auVar52,auVar128,auVar117);
            auVar126 = vfmadd213ps_avx512vl(auVar125,auVar128,auVar112);
            auVar113 = vfmadd213ps_avx512vl(auVar54,ZEXT1632(auVar108),auVar118);
            auVar109 = vfnmadd213ps_fma(auVar51,auVar128,auVar116);
            auVar124 = ZEXT1632(auVar108);
            auVar107 = vfmadd213ps_fma(auVar55,auVar124,auVar119);
            auVar103 = vfnmadd213ps_fma(auVar52,auVar128,auVar117);
            auVar29 = vfmadd213ps_fma(auVar127,auVar124,auVar111);
            auVar117 = ZEXT1632(auVar104);
            auVar162 = vfnmadd231ps_fma(auVar112,auVar117,auVar125);
            auVar160 = vfnmadd213ps_fma(auVar54,auVar124,auVar118);
            auVar161 = vfnmadd213ps_fma(auVar55,auVar124,auVar119);
            auVar110 = vfnmadd231ps_fma(auVar111,ZEXT1632(auVar108),auVar127);
            auVar111 = vsubps_avx512vl(auVar113,ZEXT1632(auVar109));
            auVar127 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar103));
            auVar128 = vsubps_avx(ZEXT1632(auVar29),ZEXT1632(auVar162));
            auVar56._4_4_ = auVar127._4_4_ * auVar162._4_4_;
            auVar56._0_4_ = auVar127._0_4_ * auVar162._0_4_;
            auVar56._8_4_ = auVar127._8_4_ * auVar162._8_4_;
            auVar56._12_4_ = auVar127._12_4_ * auVar162._12_4_;
            auVar56._16_4_ = auVar127._16_4_ * 0.0;
            auVar56._20_4_ = auVar127._20_4_ * 0.0;
            auVar56._24_4_ = auVar127._24_4_ * 0.0;
            auVar56._28_4_ = auVar125._28_4_;
            auVar104 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar103),auVar128);
            auVar57._4_4_ = auVar128._4_4_ * auVar109._4_4_;
            auVar57._0_4_ = auVar128._0_4_ * auVar109._0_4_;
            auVar57._8_4_ = auVar128._8_4_ * auVar109._8_4_;
            auVar57._12_4_ = auVar128._12_4_ * auVar109._12_4_;
            auVar57._16_4_ = auVar128._16_4_ * 0.0;
            auVar57._20_4_ = auVar128._20_4_ * 0.0;
            auVar57._24_4_ = auVar128._24_4_ * 0.0;
            auVar57._28_4_ = auVar128._28_4_;
            auVar30 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar162),auVar111);
            auVar58._4_4_ = auVar103._4_4_ * auVar111._4_4_;
            auVar58._0_4_ = auVar103._0_4_ * auVar111._0_4_;
            auVar58._8_4_ = auVar103._8_4_ * auVar111._8_4_;
            auVar58._12_4_ = auVar103._12_4_ * auVar111._12_4_;
            auVar58._16_4_ = auVar111._16_4_ * 0.0;
            auVar58._20_4_ = auVar111._20_4_ * 0.0;
            auVar58._24_4_ = auVar111._24_4_ * 0.0;
            auVar58._28_4_ = auVar111._28_4_;
            auVar105 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar109),auVar127);
            auVar127 = vfmadd231ps_avx512vl(ZEXT1632(auVar105),auVar120,ZEXT1632(auVar30));
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar120,ZEXT1632(auVar104));
            uVar91 = vcmpps_avx512vl(auVar127,auVar120,2);
            bVar100 = (byte)uVar91;
            fVar151 = (float)((uint)(bVar100 & 1) * auVar164._0_4_ |
                             (uint)!(bool)(bVar100 & 1) * auVar160._0_4_);
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            fVar153 = (float)((uint)bVar13 * auVar164._4_4_ | (uint)!bVar13 * auVar160._4_4_);
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            fVar156 = (float)((uint)bVar13 * auVar164._8_4_ | (uint)!bVar13 * auVar160._8_4_);
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            fVar157 = (float)((uint)bVar13 * auVar164._12_4_ | (uint)!bVar13 * auVar160._12_4_);
            auVar124 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar156,CONCAT44(fVar153,fVar151))));
            fVar152 = (float)((uint)(bVar100 & 1) * auVar163._0_4_ |
                             (uint)!(bool)(bVar100 & 1) * auVar161._0_4_);
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            fVar155 = (float)((uint)bVar13 * auVar163._4_4_ | (uint)!bVar13 * auVar161._4_4_);
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            fVar154 = (float)((uint)bVar13 * auVar163._8_4_ | (uint)!bVar13 * auVar161._8_4_);
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            fVar158 = (float)((uint)bVar13 * auVar163._12_4_ | (uint)!bVar13 * auVar161._12_4_);
            auVar114 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar154,CONCAT44(fVar155,fVar152))));
            auVar142._0_4_ =
                 (float)((uint)(bVar100 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar100 & 1) * auVar110._0_4_);
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar110._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar110._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar110._12_4_);
            fVar207 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar126._16_4_);
            auVar142._16_4_ = fVar207;
            fVar206 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar126._20_4_);
            auVar142._20_4_ = fVar206;
            fVar199 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar126._24_4_);
            auVar142._24_4_ = fVar199;
            iVar1 = (uint)(byte)(uVar91 >> 7) * auVar126._28_4_;
            auVar142._28_4_ = iVar1;
            auVar127 = vblendmps_avx512vl(ZEXT1632(auVar109),auVar113);
            auVar143._0_4_ =
                 (uint)(bVar100 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar100 & 1) * auVar104._0_4_;
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar104._4_4_;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar104._8_4_;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar104._12_4_;
            auVar143._16_4_ = (uint)((byte)(uVar91 >> 4) & 1) * auVar127._16_4_;
            auVar143._20_4_ = (uint)((byte)(uVar91 >> 5) & 1) * auVar127._20_4_;
            auVar143._24_4_ = (uint)((byte)(uVar91 >> 6) & 1) * auVar127._24_4_;
            auVar143._28_4_ = (uint)(byte)(uVar91 >> 7) * auVar127._28_4_;
            auVar127 = vblendmps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar107));
            auVar144._0_4_ =
                 (float)((uint)(bVar100 & 1) * auVar127._0_4_ |
                        (uint)!(bool)(bVar100 & 1) * auVar164._0_4_);
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar144._4_4_ = (float)((uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar164._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar144._8_4_ = (float)((uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar164._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar144._12_4_ =
                 (float)((uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar164._12_4_);
            fVar198 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar127._16_4_);
            auVar144._16_4_ = fVar198;
            fVar208 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar127._20_4_);
            auVar144._20_4_ = fVar208;
            fVar182 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar127._24_4_);
            auVar144._24_4_ = fVar182;
            auVar144._28_4_ = (uint)(byte)(uVar91 >> 7) * auVar127._28_4_;
            auVar127 = vblendmps_avx512vl(ZEXT1632(auVar162),ZEXT1632(auVar29));
            auVar145._0_4_ =
                 (float)((uint)(bVar100 & 1) * auVar127._0_4_ |
                        (uint)!(bool)(bVar100 & 1) * auVar163._0_4_);
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar145._4_4_ = (float)((uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * auVar163._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar145._8_4_ = (float)((uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * auVar163._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar145._12_4_ =
                 (float)((uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * auVar163._12_4_);
            fVar102 = (float)((uint)((byte)(uVar91 >> 4) & 1) * auVar127._16_4_);
            auVar145._16_4_ = fVar102;
            fVar150 = (float)((uint)((byte)(uVar91 >> 5) & 1) * auVar127._20_4_);
            auVar145._20_4_ = fVar150;
            fVar101 = (float)((uint)((byte)(uVar91 >> 6) & 1) * auVar127._24_4_);
            auVar145._24_4_ = fVar101;
            iVar2 = (uint)(byte)(uVar91 >> 7) * auVar127._28_4_;
            auVar145._28_4_ = iVar2;
            auVar146._0_4_ =
                 (uint)(bVar100 & 1) * (int)auVar109._0_4_ |
                 (uint)!(bool)(bVar100 & 1) * auVar113._0_4_;
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            auVar146._4_4_ = (uint)bVar13 * (int)auVar109._4_4_ | (uint)!bVar13 * auVar113._4_4_;
            bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
            auVar146._8_4_ = (uint)bVar13 * (int)auVar109._8_4_ | (uint)!bVar13 * auVar113._8_4_;
            bVar13 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar146._12_4_ = (uint)bVar13 * (int)auVar109._12_4_ | (uint)!bVar13 * auVar113._12_4_;
            auVar146._16_4_ = (uint)!(bool)((byte)(uVar91 >> 4) & 1) * auVar113._16_4_;
            auVar146._20_4_ = (uint)!(bool)((byte)(uVar91 >> 5) & 1) * auVar113._20_4_;
            auVar146._24_4_ = (uint)!(bool)((byte)(uVar91 >> 6) & 1) * auVar113._24_4_;
            auVar146._28_4_ = (uint)!SUB81(uVar91 >> 7,0) * auVar113._28_4_;
            bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar91 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar91 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar91 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar91 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
            auVar113 = vsubps_avx512vl(auVar146,auVar124);
            auVar128 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar103._12_4_ |
                                                     (uint)!bVar17 * auVar107._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar103._8_4_ |
                                                              (uint)!bVar15 * auVar107._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar103._4_4_ |
                                                                       (uint)!bVar13 *
                                                                       auVar107._4_4_,
                                                                       (uint)(bVar100 & 1) *
                                                                       (int)auVar103._0_4_ |
                                                                       (uint)!(bool)(bVar100 & 1) *
                                                                       auVar107._0_4_)))),auVar114);
            auVar126 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar162._12_4_ |
                                                     (uint)!bVar18 * auVar29._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar162._8_4_ |
                                                              (uint)!bVar16 * auVar29._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar162._4_4_ |
                                                                       (uint)!bVar14 * auVar29._4_4_
                                                                       ,(uint)(bVar100 & 1) *
                                                                        (int)auVar162._0_4_ |
                                                                        (uint)!(bool)(bVar100 & 1) *
                                                                        auVar29._0_4_)))),auVar142);
            auVar125 = vsubps_avx(auVar124,auVar143);
            auVar111 = vsubps_avx(auVar114,auVar144);
            auVar112 = vsubps_avx(auVar142,auVar145);
            auVar59._4_4_ = auVar126._4_4_ * fVar153;
            auVar59._0_4_ = auVar126._0_4_ * fVar151;
            auVar59._8_4_ = auVar126._8_4_ * fVar156;
            auVar59._12_4_ = auVar126._12_4_ * fVar157;
            auVar59._16_4_ = auVar126._16_4_ * 0.0;
            auVar59._20_4_ = auVar126._20_4_ * 0.0;
            auVar59._24_4_ = auVar126._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar104 = vfmsub231ps_fma(auVar59,auVar142,auVar113);
            auVar196._0_4_ = fVar152 * auVar113._0_4_;
            auVar196._4_4_ = fVar155 * auVar113._4_4_;
            auVar196._8_4_ = fVar154 * auVar113._8_4_;
            auVar196._12_4_ = fVar158 * auVar113._12_4_;
            auVar196._16_4_ = auVar113._16_4_ * 0.0;
            auVar196._20_4_ = auVar113._20_4_ * 0.0;
            auVar196._24_4_ = auVar113._24_4_ * 0.0;
            auVar196._28_4_ = 0;
            auVar164 = vfmsub231ps_fma(auVar196,auVar124,auVar128);
            auVar127 = vfmadd231ps_avx512vl(ZEXT1632(auVar164),auVar120,ZEXT1632(auVar104));
            auVar204._0_4_ = auVar128._0_4_ * auVar142._0_4_;
            auVar204._4_4_ = auVar128._4_4_ * auVar142._4_4_;
            auVar204._8_4_ = auVar128._8_4_ * auVar142._8_4_;
            auVar204._12_4_ = auVar128._12_4_ * auVar142._12_4_;
            auVar204._16_4_ = auVar128._16_4_ * fVar207;
            auVar204._20_4_ = auVar128._20_4_ * fVar206;
            auVar204._24_4_ = auVar128._24_4_ * fVar199;
            auVar204._28_4_ = 0;
            auVar104 = vfmsub231ps_fma(auVar204,auVar114,auVar126);
            auVar115 = vfmadd231ps_avx512vl(auVar127,auVar120,ZEXT1632(auVar104));
            auVar127 = vmulps_avx512vl(auVar112,auVar143);
            auVar127 = vfmsub231ps_avx512vl(auVar127,auVar125,auVar145);
            auVar60._4_4_ = auVar111._4_4_ * auVar145._4_4_;
            auVar60._0_4_ = auVar111._0_4_ * auVar145._0_4_;
            auVar60._8_4_ = auVar111._8_4_ * auVar145._8_4_;
            auVar60._12_4_ = auVar111._12_4_ * auVar145._12_4_;
            auVar60._16_4_ = auVar111._16_4_ * fVar102;
            auVar60._20_4_ = auVar111._20_4_ * fVar150;
            auVar60._24_4_ = auVar111._24_4_ * fVar101;
            auVar60._28_4_ = iVar2;
            auVar104 = vfmsub231ps_fma(auVar60,auVar144,auVar112);
            auVar205._0_4_ = auVar144._0_4_ * auVar125._0_4_;
            auVar205._4_4_ = auVar144._4_4_ * auVar125._4_4_;
            auVar205._8_4_ = auVar144._8_4_ * auVar125._8_4_;
            auVar205._12_4_ = auVar144._12_4_ * auVar125._12_4_;
            auVar205._16_4_ = fVar198 * auVar125._16_4_;
            auVar205._20_4_ = fVar208 * auVar125._20_4_;
            auVar205._24_4_ = fVar182 * auVar125._24_4_;
            auVar205._28_4_ = 0;
            auVar164 = vfmsub231ps_fma(auVar205,auVar111,auVar143);
            auVar127 = vfmadd231ps_avx512vl(ZEXT1632(auVar164),auVar120,auVar127);
            auVar116 = vfmadd231ps_avx512vl(auVar127,auVar120,ZEXT1632(auVar104));
            auVar127 = vmaxps_avx(auVar115,auVar116);
            uVar175 = vcmpps_avx512vl(auVar127,auVar120,2);
            local_630 = local_630 & (byte)uVar175;
            if (local_630 == 0) {
LAB_01b6bd75:
              local_630 = 0;
            }
            else {
              auVar61._4_4_ = auVar112._4_4_ * auVar128._4_4_;
              auVar61._0_4_ = auVar112._0_4_ * auVar128._0_4_;
              auVar61._8_4_ = auVar112._8_4_ * auVar128._8_4_;
              auVar61._12_4_ = auVar112._12_4_ * auVar128._12_4_;
              auVar61._16_4_ = auVar112._16_4_ * auVar128._16_4_;
              auVar61._20_4_ = auVar112._20_4_ * auVar128._20_4_;
              auVar61._24_4_ = auVar112._24_4_ * auVar128._24_4_;
              auVar61._28_4_ = auVar127._28_4_;
              auVar163 = vfmsub231ps_fma(auVar61,auVar111,auVar126);
              auVar62._4_4_ = auVar126._4_4_ * auVar125._4_4_;
              auVar62._0_4_ = auVar126._0_4_ * auVar125._0_4_;
              auVar62._8_4_ = auVar126._8_4_ * auVar125._8_4_;
              auVar62._12_4_ = auVar126._12_4_ * auVar125._12_4_;
              auVar62._16_4_ = auVar126._16_4_ * auVar125._16_4_;
              auVar62._20_4_ = auVar126._20_4_ * auVar125._20_4_;
              auVar62._24_4_ = auVar126._24_4_ * auVar125._24_4_;
              auVar62._28_4_ = auVar126._28_4_;
              auVar164 = vfmsub231ps_fma(auVar62,auVar113,auVar112);
              auVar63._4_4_ = auVar111._4_4_ * auVar113._4_4_;
              auVar63._0_4_ = auVar111._0_4_ * auVar113._0_4_;
              auVar63._8_4_ = auVar111._8_4_ * auVar113._8_4_;
              auVar63._12_4_ = auVar111._12_4_ * auVar113._12_4_;
              auVar63._16_4_ = auVar111._16_4_ * auVar113._16_4_;
              auVar63._20_4_ = auVar111._20_4_ * auVar113._20_4_;
              auVar63._24_4_ = auVar111._24_4_ * auVar113._24_4_;
              auVar63._28_4_ = auVar111._28_4_;
              auVar107 = vfmsub231ps_fma(auVar63,auVar125,auVar128);
              auVar104 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar164),ZEXT1632(auVar107));
              auVar127 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar163),auVar120);
              auVar128 = vrcp14ps_avx512vl(auVar127);
              auVar38._8_4_ = 0x3f800000;
              auVar38._0_8_ = &DAT_3f8000003f800000;
              auVar38._12_4_ = 0x3f800000;
              auVar38._16_4_ = 0x3f800000;
              auVar38._20_4_ = 0x3f800000;
              auVar38._24_4_ = 0x3f800000;
              auVar38._28_4_ = 0x3f800000;
              auVar126 = vfnmadd213ps_avx512vl(auVar128,auVar127,auVar38);
              auVar104 = vfmadd132ps_fma(auVar126,auVar128,auVar128);
              auVar64._4_4_ = auVar107._4_4_ * auVar142._4_4_;
              auVar64._0_4_ = auVar107._0_4_ * auVar142._0_4_;
              auVar64._8_4_ = auVar107._8_4_ * auVar142._8_4_;
              auVar64._12_4_ = auVar107._12_4_ * auVar142._12_4_;
              auVar64._16_4_ = fVar207 * 0.0;
              auVar64._20_4_ = fVar206 * 0.0;
              auVar64._24_4_ = fVar199 * 0.0;
              auVar64._28_4_ = iVar1;
              auVar164 = vfmadd231ps_fma(auVar64,auVar114,ZEXT1632(auVar164));
              auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar124,ZEXT1632(auVar163));
              fVar199 = auVar104._0_4_;
              fVar206 = auVar104._4_4_;
              fVar207 = auVar104._8_4_;
              fVar208 = auVar104._12_4_;
              auVar128 = ZEXT1632(CONCAT412(auVar164._12_4_ * fVar208,
                                            CONCAT48(auVar164._8_4_ * fVar207,
                                                     CONCAT44(auVar164._4_4_ * fVar206,
                                                              auVar164._0_4_ * fVar199))));
              auVar88._4_4_ = uStack_71c;
              auVar88._0_4_ = local_720;
              auVar88._8_4_ = uStack_718;
              auVar88._12_4_ = uStack_714;
              auVar88._16_4_ = uStack_710;
              auVar88._20_4_ = uStack_70c;
              auVar88._24_4_ = uStack_708;
              auVar88._28_4_ = uStack_704;
              uVar175 = vcmpps_avx512vl(auVar128,auVar88,0xd);
              uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar39._4_4_ = uVar159;
              auVar39._0_4_ = uVar159;
              auVar39._8_4_ = uVar159;
              auVar39._12_4_ = uVar159;
              auVar39._16_4_ = uVar159;
              auVar39._20_4_ = uVar159;
              auVar39._24_4_ = uVar159;
              auVar39._28_4_ = uVar159;
              uVar32 = vcmpps_avx512vl(auVar128,auVar39,2);
              local_630 = (byte)uVar175 & (byte)uVar32 & local_630;
              if (local_630 == 0) goto LAB_01b6bd75;
              uVar175 = vcmpps_avx512vl(auVar127,auVar120,4);
              if ((local_630 & (byte)uVar175) == 0) {
                local_630 = 0;
              }
              else {
                local_630 = local_630 & (byte)uVar175;
                fVar182 = auVar115._0_4_ * fVar199;
                fVar198 = auVar115._4_4_ * fVar206;
                auVar65._4_4_ = fVar198;
                auVar65._0_4_ = fVar182;
                fVar101 = auVar115._8_4_ * fVar207;
                auVar65._8_4_ = fVar101;
                fVar102 = auVar115._12_4_ * fVar208;
                auVar65._12_4_ = fVar102;
                fVar150 = auVar115._16_4_ * 0.0;
                auVar65._16_4_ = fVar150;
                fVar151 = auVar115._20_4_ * 0.0;
                auVar65._20_4_ = fVar151;
                fVar152 = auVar115._24_4_ * 0.0;
                auVar65._24_4_ = fVar152;
                auVar65._28_4_ = auVar115._28_4_;
                fVar199 = auVar116._0_4_ * fVar199;
                fVar206 = auVar116._4_4_ * fVar206;
                auVar66._4_4_ = fVar206;
                auVar66._0_4_ = fVar199;
                fVar207 = auVar116._8_4_ * fVar207;
                auVar66._8_4_ = fVar207;
                fVar208 = auVar116._12_4_ * fVar208;
                auVar66._12_4_ = fVar208;
                fVar153 = auVar116._16_4_ * 0.0;
                auVar66._16_4_ = fVar153;
                fVar155 = auVar116._20_4_ * 0.0;
                auVar66._20_4_ = fVar155;
                fVar156 = auVar116._24_4_ * 0.0;
                auVar66._24_4_ = fVar156;
                auVar66._28_4_ = auVar116._28_4_;
                auVar215._8_4_ = 0x3f800000;
                auVar215._0_8_ = &DAT_3f8000003f800000;
                auVar215._12_4_ = 0x3f800000;
                auVar215._16_4_ = 0x3f800000;
                auVar215._20_4_ = 0x3f800000;
                auVar215._24_4_ = 0x3f800000;
                auVar215._28_4_ = 0x3f800000;
                auVar127 = vsubps_avx512vl(auVar215,auVar65);
                bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar91 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar91 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar91 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
                bVar19 = SUB81(uVar91 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar115._28_4_ |
                                              (uint)!bVar19 * auVar127._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar152 |
                                                        (uint)!bVar18 * auVar127._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar151 |
                                                                  (uint)!bVar17 * auVar127._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar150 |
                                                                            (uint)!bVar16 *
                                                                            auVar127._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar102 |
                                                                                      (uint)!bVar15
                                                                                      * auVar127.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar101 |
                                                                  (uint)!bVar14 * auVar127._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar198 |
                                                                           (uint)!bVar13 *
                                                                           auVar127._4_4_,
                                                                           (uint)(bVar100 & 1) *
                                                                           (int)fVar182 |
                                                                           (uint)!(bool)(bVar100 & 1
                                                                                        ) *
                                                                           auVar127._0_4_))))))));
                auVar127 = vsubps_avx(auVar215,auVar66);
                bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar91 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar91 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar91 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
                bVar19 = SUB81(uVar91 >> 7,0);
                local_580._4_4_ = (uint)bVar13 * (int)fVar206 | (uint)!bVar13 * auVar127._4_4_;
                local_580._0_4_ =
                     (uint)(bVar100 & 1) * (int)fVar199 |
                     (uint)!(bool)(bVar100 & 1) * auVar127._0_4_;
                local_580._8_4_ = (uint)bVar14 * (int)fVar207 | (uint)!bVar14 * auVar127._8_4_;
                local_580._12_4_ = (uint)bVar15 * (int)fVar208 | (uint)!bVar15 * auVar127._12_4_;
                local_580._16_4_ = (uint)bVar16 * (int)fVar153 | (uint)!bVar16 * auVar127._16_4_;
                local_580._20_4_ = (uint)bVar17 * (int)fVar155 | (uint)!bVar17 * auVar127._20_4_;
                local_580._24_4_ = (uint)bVar18 * (int)fVar156 | (uint)!bVar18 * auVar127._24_4_;
                local_580._28_4_ = (uint)bVar19 * auVar116._28_4_ | (uint)!bVar19 * auVar127._28_4_;
                in_ZMM21 = ZEXT3264(auVar128);
              }
            }
            auVar234 = ZEXT3264(local_860);
            auVar233 = ZEXT3264(local_880);
            if (local_630 != 0) {
              auVar127 = vsubps_avx(ZEXT1632(auVar108),auVar117);
              local_7e0 = in_ZMM20._0_32_;
              auVar127 = vfmadd213ps_avx512vl(auVar127,local_7e0,auVar117);
              auVar169._0_4_ = auVar127._0_4_ + auVar127._0_4_;
              auVar169._4_4_ = auVar127._4_4_ + auVar127._4_4_;
              auVar169._8_4_ = auVar127._8_4_ + auVar127._8_4_;
              auVar169._12_4_ = auVar127._12_4_ + auVar127._12_4_;
              auVar169._16_4_ = auVar127._16_4_ + auVar127._16_4_;
              auVar169._20_4_ = auVar127._20_4_ + auVar127._20_4_;
              auVar169._24_4_ = auVar127._24_4_ + auVar127._24_4_;
              auVar169._28_4_ = auVar127._28_4_ + auVar127._28_4_;
              uVar159 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar40._4_4_ = uVar159;
              auVar40._0_4_ = uVar159;
              auVar40._8_4_ = uVar159;
              auVar40._12_4_ = uVar159;
              auVar40._16_4_ = uVar159;
              auVar40._20_4_ = uVar159;
              auVar40._24_4_ = uVar159;
              auVar40._28_4_ = uVar159;
              auVar127 = vmulps_avx512vl(auVar169,auVar40);
              local_800 = in_ZMM21._0_32_;
              uVar175 = vcmpps_avx512vl(local_800,auVar127,6);
              local_630 = local_630 & (byte)uVar175;
              uVar95 = (uint)local_630;
              if (local_630 != 0) {
                auVar170._8_4_ = 0xbf800000;
                auVar170._0_8_ = 0xbf800000bf800000;
                auVar170._12_4_ = 0xbf800000;
                auVar170._16_4_ = 0xbf800000;
                auVar170._20_4_ = 0xbf800000;
                auVar170._24_4_ = 0xbf800000;
                auVar170._28_4_ = 0xbf800000;
                auVar41._8_4_ = 0x40000000;
                auVar41._0_8_ = 0x4000000040000000;
                auVar41._12_4_ = 0x40000000;
                auVar41._16_4_ = 0x40000000;
                auVar41._20_4_ = 0x40000000;
                auVar41._24_4_ = 0x40000000;
                auVar41._28_4_ = 0x40000000;
                local_6c0 = vfmadd132ps_avx512vl(local_580,auVar170,auVar41);
                local_580 = local_6c0;
                auVar127 = local_580;
                local_680 = (undefined4)lVar98;
                local_640 = CONCAT44(fStack_89c,local_8a0);
                uStack_638 = CONCAT44(fStack_894,fStack_898);
                pGVar96 = (context->scene->geometries).items[uVar97].ptr;
                local_580 = auVar127;
                if ((pGVar96->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar127 = vaddps_avx512vl(local_7e0,_DAT_02020f40);
                  auVar104 = vcvtsi2ss_avx512f(local_360._0_16_,local_680);
                  fVar199 = auVar104._0_4_;
                  local_620[0] = (fVar199 + auVar127._0_4_) * local_700;
                  local_620[1] = (fVar199 + auVar127._4_4_) * (float)auStack_6fc._0_4_;
                  local_620[2] = (fVar199 + auVar127._8_4_) * (float)auStack_6fc._4_4_;
                  local_620[3] = (fVar199 + auVar127._12_4_) * fStack_6f4;
                  fStack_610 = (fVar199 + auVar127._16_4_) * fStack_6f0;
                  fStack_60c = (fVar199 + auVar127._20_4_) * fStack_6ec;
                  fStack_608 = (fVar199 + auVar127._24_4_) * fStack_6e8;
                  fStack_604 = fVar199 + auVar127._28_4_;
                  local_580._0_8_ = local_6c0._0_8_;
                  local_580._8_8_ = local_6c0._8_8_;
                  local_580._16_8_ = local_6c0._16_8_;
                  local_580._24_8_ = local_6c0._24_8_;
                  local_600 = local_580._0_8_;
                  uStack_5f8 = local_580._8_8_;
                  uStack_5f0 = local_580._16_8_;
                  uStack_5e8 = local_580._24_8_;
                  local_5e0 = local_800;
                  auVar171._8_4_ = 0x7f800000;
                  auVar171._0_8_ = 0x7f8000007f800000;
                  auVar171._12_4_ = 0x7f800000;
                  auVar171._16_4_ = 0x7f800000;
                  auVar171._20_4_ = 0x7f800000;
                  auVar171._24_4_ = 0x7f800000;
                  auVar171._28_4_ = 0x7f800000;
                  auVar127 = vblendmps_avx512vl(auVar171,local_800);
                  auVar147._0_4_ =
                       (uint)(local_630 & 1) * auVar127._0_4_ |
                       (uint)!(bool)(local_630 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_630 >> 1 & 1);
                  auVar147._4_4_ = (uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_630 >> 2 & 1);
                  auVar147._8_4_ = (uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_630 >> 3 & 1);
                  auVar147._12_4_ = (uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_630 >> 4 & 1);
                  auVar147._16_4_ = (uint)bVar13 * auVar127._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_630 >> 5 & 1);
                  auVar147._20_4_ = (uint)bVar13 * auVar127._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_630 >> 6 & 1);
                  auVar147._24_4_ = (uint)bVar13 * auVar127._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar147._28_4_ =
                       (uint)(local_630 >> 7) * auVar127._28_4_ |
                       (uint)!(bool)(local_630 >> 7) * 0x7f800000;
                  auVar127 = vshufps_avx(auVar147,auVar147,0xb1);
                  auVar127 = vminps_avx(auVar147,auVar127);
                  auVar128 = vshufpd_avx(auVar127,auVar127,5);
                  auVar127 = vminps_avx(auVar127,auVar128);
                  auVar128 = vpermpd_avx2(auVar127,0x4e);
                  auVar127 = vminps_avx(auVar127,auVar128);
                  uVar175 = vcmpps_avx512vl(auVar147,auVar127,0);
                  bVar90 = (byte)uVar175 & local_630;
                  bVar100 = local_630;
                  if (bVar90 != 0) {
                    bVar100 = bVar90;
                  }
                  uVar93 = 0;
                  for (uVar92 = (uint)bVar100; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000)
                  {
                    uVar93 = uVar93 + 1;
                  }
                  uVar91 = (ulong)uVar93;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar96->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar199 = local_620[uVar91];
                    uVar159 = *(undefined4 *)((long)&local_600 + uVar91 * 4);
                    fVar206 = 1.0 - fVar199;
                    auVar163 = vfnmadd231ss_fma(ZEXT416((uint)(fVar199 * (fVar206 + fVar206))),
                                                ZEXT416((uint)fVar206),ZEXT416((uint)fVar206));
                    auVar164 = ZEXT416((uint)fVar199);
                    auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar164,
                                               ZEXT416(0xc0a00000));
                    auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199 * 3.0)),
                                               ZEXT416((uint)(fVar199 + fVar199)),auVar104);
                    auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar164,
                                               ZEXT416(0x40000000));
                    auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * -3.0)),
                                               ZEXT416((uint)(fVar206 + fVar206)),auVar104);
                    auVar164 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199)),auVar164,
                                               ZEXT416((uint)(fVar206 * -2.0)));
                    fVar206 = auVar163._0_4_ * 0.5;
                    fVar207 = auVar108._0_4_ * 0.5;
                    fVar208 = auVar104._0_4_ * 0.5;
                    fVar182 = auVar164._0_4_ * 0.5;
                    auVar189._0_4_ = fVar182 * local_8a0;
                    auVar189._4_4_ = fVar182 * fStack_89c;
                    auVar189._8_4_ = fVar182 * fStack_898;
                    auVar189._12_4_ = fVar182 * fStack_894;
                    auVar211._4_4_ = fVar208;
                    auVar211._0_4_ = fVar208;
                    auVar211._8_4_ = fVar208;
                    auVar211._12_4_ = fVar208;
                    auVar104 = vfmadd132ps_fma(auVar211,auVar189,auVar27);
                    auVar190._4_4_ = fVar207;
                    auVar190._0_4_ = fVar207;
                    auVar190._8_4_ = fVar207;
                    auVar190._12_4_ = fVar207;
                    auVar104 = vfmadd132ps_fma(auVar190,auVar104,auVar28);
                    auVar181._4_4_ = fVar206;
                    auVar181._0_4_ = fVar206;
                    auVar181._8_4_ = fVar206;
                    auVar181._12_4_ = fVar206;
                    auVar104 = vfmadd213ps_fma(auVar181,auVar106,auVar104);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + uVar91 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar104._0_4_;
                    uVar11 = vextractps_avx(auVar104,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar11;
                    uVar11 = vextractps_avx(auVar104,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar11;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar199;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar159;
                    *(uint *)(ray + k * 4 + 0x440) = uVar9;
                    *(uint *)(ray + k * 4 + 0x480) = uVar97;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_7c0 = (float)uVar81;
                    fStack_7bc = (float)((ulong)uVar81 >> 0x20);
                    fStack_7b8 = (float)uVar82;
                    fStack_7b4 = (float)((ulong)uVar82 >> 0x20);
                    local_540 = local_640;
                    uStack_538 = uStack_638;
                    local_890 = pGVar96;
                    local_7b0 = uVar31;
                    uStack_7a8 = uVar80;
                    local_6e0 = local_7e0;
                    local_6a0 = local_800;
                    local_67c = iVar10;
                    local_670 = auVar106;
                    local_660 = uVar31;
                    uStack_658 = uVar80;
                    local_650 = uVar81;
                    uStack_648 = uVar82;
                    do {
                      auVar107 = auVar236._0_16_;
                      local_7a0 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[uVar91]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_600 + uVar91 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + uVar91 * 4)
                      ;
                      local_8d0.context = context->user;
                      fVar206 = local_200._0_4_;
                      fVar199 = 1.0 - fVar206;
                      auVar163 = vfnmadd231ss_fma(ZEXT416((uint)(fVar206 * (fVar199 + fVar199))),
                                                  ZEXT416((uint)fVar199),ZEXT416((uint)fVar199));
                      auVar164 = local_200._0_16_;
                      auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar164,
                                                 ZEXT416(0xc0a00000));
                      auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * 3.0)),
                                                 ZEXT416((uint)(fVar206 + fVar206)),auVar104);
                      auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar164,
                                                 ZEXT416(0x40000000));
                      auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199 * -3.0)),
                                                 ZEXT416((uint)(fVar199 + fVar199)),auVar104);
                      auVar164 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),auVar164,
                                                 ZEXT416((uint)(fVar199 * -2.0)));
                      fVar199 = auVar163._0_4_ * 0.5;
                      fVar206 = auVar108._0_4_ * 0.5;
                      fVar207 = auVar104._0_4_ * 0.5;
                      fVar208 = auVar164._0_4_ * 0.5;
                      auVar191._0_4_ = fVar208 * (float)local_540;
                      auVar191._4_4_ = fVar208 * local_540._4_4_;
                      auVar191._8_4_ = fVar208 * (float)uStack_538;
                      auVar191._12_4_ = fVar208 * uStack_538._4_4_;
                      auVar212._4_4_ = fVar207;
                      auVar212._0_4_ = fVar207;
                      auVar212._8_4_ = fVar207;
                      auVar212._12_4_ = fVar207;
                      auVar84._4_4_ = fStack_7bc;
                      auVar84._0_4_ = local_7c0;
                      auVar84._8_4_ = fStack_7b8;
                      auVar84._12_4_ = fStack_7b4;
                      auVar104 = vfmadd132ps_fma(auVar212,auVar191,auVar84);
                      auVar192._4_4_ = fVar206;
                      auVar192._0_4_ = fVar206;
                      auVar192._8_4_ = fVar206;
                      auVar192._12_4_ = fVar206;
                      auVar85._8_8_ = uStack_7a8;
                      auVar85._0_8_ = local_7b0;
                      auVar104 = vfmadd132ps_fma(auVar192,auVar104,auVar85);
                      auVar165._4_4_ = fVar199;
                      auVar165._0_4_ = fVar199;
                      auVar165._8_4_ = fVar199;
                      auVar165._12_4_ = fVar199;
                      auVar104 = vfmadd213ps_fma(auVar165,auVar106,auVar104);
                      auVar197 = vbroadcastss_avx512f(auVar104);
                      auVar219 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar219,ZEXT1664(auVar104));
                      auVar219 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar219,ZEXT1664(auVar104));
                      local_2c0[0] = (RTCHitN)auVar197[0];
                      local_2c0[1] = (RTCHitN)auVar197[1];
                      local_2c0[2] = (RTCHitN)auVar197[2];
                      local_2c0[3] = (RTCHitN)auVar197[3];
                      local_2c0[4] = (RTCHitN)auVar197[4];
                      local_2c0[5] = (RTCHitN)auVar197[5];
                      local_2c0[6] = (RTCHitN)auVar197[6];
                      local_2c0[7] = (RTCHitN)auVar197[7];
                      local_2c0[8] = (RTCHitN)auVar197[8];
                      local_2c0[9] = (RTCHitN)auVar197[9];
                      local_2c0[10] = (RTCHitN)auVar197[10];
                      local_2c0[0xb] = (RTCHitN)auVar197[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar197[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar197[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar197[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar197[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar197[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar197[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar197[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar197[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar197[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar197[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar197[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar197[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar197[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar197[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar197[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar197[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar197[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar197[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar197[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar197[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar197[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar197[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar197[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar197[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar197[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar197[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar197[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar197[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar197[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar197[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar197[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar197[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar197[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar197[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar197[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar197[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar197[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar197[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar197[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar197[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar197[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar197[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar197[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar197[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar197[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar197[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar197[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar197[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar197[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar197[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar197[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar197[0x3f];
                      local_180 = local_4c0._0_8_;
                      uStack_178 = local_4c0._8_8_;
                      uStack_170 = local_4c0._16_8_;
                      uStack_168 = local_4c0._24_8_;
                      uStack_160 = local_4c0._32_8_;
                      uStack_158 = local_4c0._40_8_;
                      uStack_150 = local_4c0._48_8_;
                      uStack_148 = local_4c0._56_8_;
                      auVar197 = vmovdqa64_avx512f(local_480);
                      local_140 = vmovdqa64_avx512f(auVar197);
                      auVar127 = vpcmpeqd_avx2(auVar197._0_32_,auVar197._0_32_);
                      local_888[3] = auVar127;
                      local_888[2] = auVar127;
                      local_888[1] = auVar127;
                      *local_888 = auVar127;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_8d0.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_8d0.context)->instPrimID[0]));
                      local_5c0 = local_300;
                      local_8d0.valid = (int *)local_5c0;
                      local_8d0.geometryUserPtr = pGVar96->userPtr;
                      local_8d0.hit = local_2c0;
                      local_8d0.N = 0x10;
                      local_500._0_4_ = uVar95;
                      local_8d0.ray = (RTCRayN *)ray;
                      if (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar96->intersectionFilterN)(&local_8d0);
                        auVar237 = ZEXT3264(local_840);
                        auVar174 = ZEXT3264(local_820);
                        auVar233 = ZEXT3264(local_880);
                        auVar234 = ZEXT3264(local_860);
                        auVar235 = ZEXT3264(local_760);
                        in_ZMM21 = ZEXT3264(local_800);
                        in_ZMM20 = ZEXT3264(local_7e0);
                        auVar104 = vxorps_avx512vl(auVar107,auVar107);
                        auVar236 = ZEXT1664(auVar104);
                        pGVar96 = local_890;
                        uVar95 = local_500._0_4_;
                      }
                      bVar100 = (byte)uVar95;
                      auVar104 = auVar236._0_16_;
                      auVar197 = vmovdqa64_avx512f(local_5c0);
                      uVar175 = vptestmd_avx512f(auVar197,auVar197);
                      if ((short)uVar175 == 0) {
LAB_01b6c227:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_7a0;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar96->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_8d0);
                          bVar100 = local_500[0];
                          auVar237 = ZEXT3264(local_840);
                          auVar174 = ZEXT3264(local_820);
                          auVar233 = ZEXT3264(local_880);
                          auVar234 = ZEXT3264(local_860);
                          auVar235 = ZEXT3264(local_760);
                          in_ZMM21 = ZEXT3264(local_800);
                          in_ZMM20 = ZEXT3264(local_7e0);
                          auVar104 = vxorps_avx512vl(auVar104,auVar104);
                          auVar236 = ZEXT1664(auVar104);
                          pGVar96 = local_890;
                        }
                        auVar197 = vmovdqa64_avx512f(local_5c0);
                        uVar94 = vptestmd_avx512f(auVar197,auVar197);
                        if ((short)uVar94 == 0) goto LAB_01b6c227;
                        iVar1 = *(int *)(local_8d0.hit + 4);
                        iVar2 = *(int *)(local_8d0.hit + 8);
                        iVar67 = *(int *)(local_8d0.hit + 0xc);
                        iVar68 = *(int *)(local_8d0.hit + 0x10);
                        iVar69 = *(int *)(local_8d0.hit + 0x14);
                        iVar70 = *(int *)(local_8d0.hit + 0x18);
                        iVar71 = *(int *)(local_8d0.hit + 0x1c);
                        iVar72 = *(int *)(local_8d0.hit + 0x20);
                        iVar73 = *(int *)(local_8d0.hit + 0x24);
                        iVar74 = *(int *)(local_8d0.hit + 0x28);
                        iVar75 = *(int *)(local_8d0.hit + 0x2c);
                        iVar76 = *(int *)(local_8d0.hit + 0x30);
                        iVar77 = *(int *)(local_8d0.hit + 0x34);
                        iVar78 = *(int *)(local_8d0.hit + 0x38);
                        iVar79 = *(int *)(local_8d0.hit + 0x3c);
                        bVar90 = (byte)uVar94;
                        bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                        bVar89 = (byte)(uVar94 >> 8);
                        bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                        bVar26 = SUB81(uVar94 >> 0xf,0);
                        *(uint *)(local_8d0.ray + 0x300) =
                             (uint)(bVar90 & 1) * *(int *)local_8d0.hit |
                             (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x300);
                        *(uint *)(local_8d0.ray + 0x304) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x304);
                        *(uint *)(local_8d0.ray + 0x308) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x308);
                        *(uint *)(local_8d0.ray + 0x30c) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x30c)
                        ;
                        *(uint *)(local_8d0.ray + 0x310) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x310)
                        ;
                        *(uint *)(local_8d0.ray + 0x314) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x314)
                        ;
                        *(uint *)(local_8d0.ray + 0x318) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x318)
                        ;
                        *(uint *)(local_8d0.ray + 0x31c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x31c)
                        ;
                        *(uint *)(local_8d0.ray + 800) =
                             (uint)(bVar89 & 1) * iVar72 |
                             (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 800);
                        *(uint *)(local_8d0.ray + 0x324) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x324)
                        ;
                        *(uint *)(local_8d0.ray + 0x328) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 0x328)
                        ;
                        *(uint *)(local_8d0.ray + 0x32c) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x32c)
                        ;
                        *(uint *)(local_8d0.ray + 0x330) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x330)
                        ;
                        *(uint *)(local_8d0.ray + 0x334) =
                             (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x334)
                        ;
                        *(uint *)(local_8d0.ray + 0x338) =
                             (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x338)
                        ;
                        *(uint *)(local_8d0.ray + 0x33c) =
                             (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_8d0.hit + 0x44);
                        iVar2 = *(int *)(local_8d0.hit + 0x48);
                        iVar67 = *(int *)(local_8d0.hit + 0x4c);
                        iVar68 = *(int *)(local_8d0.hit + 0x50);
                        iVar69 = *(int *)(local_8d0.hit + 0x54);
                        iVar70 = *(int *)(local_8d0.hit + 0x58);
                        iVar71 = *(int *)(local_8d0.hit + 0x5c);
                        iVar72 = *(int *)(local_8d0.hit + 0x60);
                        iVar73 = *(int *)(local_8d0.hit + 100);
                        iVar74 = *(int *)(local_8d0.hit + 0x68);
                        iVar75 = *(int *)(local_8d0.hit + 0x6c);
                        iVar76 = *(int *)(local_8d0.hit + 0x70);
                        iVar77 = *(int *)(local_8d0.hit + 0x74);
                        iVar78 = *(int *)(local_8d0.hit + 0x78);
                        iVar79 = *(int *)(local_8d0.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                        bVar26 = SUB81(uVar94 >> 0xf,0);
                        *(uint *)(local_8d0.ray + 0x340) =
                             (uint)(bVar90 & 1) * *(int *)(local_8d0.hit + 0x40) |
                             (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x340);
                        *(uint *)(local_8d0.ray + 0x344) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x344);
                        *(uint *)(local_8d0.ray + 0x348) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x348);
                        *(uint *)(local_8d0.ray + 0x34c) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x34c)
                        ;
                        *(uint *)(local_8d0.ray + 0x350) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x350)
                        ;
                        *(uint *)(local_8d0.ray + 0x354) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x354)
                        ;
                        *(uint *)(local_8d0.ray + 0x358) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x358)
                        ;
                        *(uint *)(local_8d0.ray + 0x35c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x35c)
                        ;
                        *(uint *)(local_8d0.ray + 0x360) =
                             (uint)(bVar89 & 1) * iVar72 |
                             (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 0x360);
                        *(uint *)(local_8d0.ray + 0x364) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x364)
                        ;
                        *(uint *)(local_8d0.ray + 0x368) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 0x368)
                        ;
                        *(uint *)(local_8d0.ray + 0x36c) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x36c)
                        ;
                        *(uint *)(local_8d0.ray + 0x370) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x370)
                        ;
                        *(uint *)(local_8d0.ray + 0x374) =
                             (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x374)
                        ;
                        *(uint *)(local_8d0.ray + 0x378) =
                             (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x378)
                        ;
                        *(uint *)(local_8d0.ray + 0x37c) =
                             (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_8d0.hit + 0x84);
                        iVar2 = *(int *)(local_8d0.hit + 0x88);
                        iVar67 = *(int *)(local_8d0.hit + 0x8c);
                        iVar68 = *(int *)(local_8d0.hit + 0x90);
                        iVar69 = *(int *)(local_8d0.hit + 0x94);
                        iVar70 = *(int *)(local_8d0.hit + 0x98);
                        iVar71 = *(int *)(local_8d0.hit + 0x9c);
                        iVar72 = *(int *)(local_8d0.hit + 0xa0);
                        iVar73 = *(int *)(local_8d0.hit + 0xa4);
                        iVar74 = *(int *)(local_8d0.hit + 0xa8);
                        iVar75 = *(int *)(local_8d0.hit + 0xac);
                        iVar76 = *(int *)(local_8d0.hit + 0xb0);
                        iVar77 = *(int *)(local_8d0.hit + 0xb4);
                        iVar78 = *(int *)(local_8d0.hit + 0xb8);
                        iVar79 = *(int *)(local_8d0.hit + 0xbc);
                        bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                        bVar26 = SUB81(uVar94 >> 0xf,0);
                        *(uint *)(local_8d0.ray + 0x380) =
                             (uint)(bVar90 & 1) * *(int *)(local_8d0.hit + 0x80) |
                             (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x380);
                        *(uint *)(local_8d0.ray + 900) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 900);
                        *(uint *)(local_8d0.ray + 0x388) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x388);
                        *(uint *)(local_8d0.ray + 0x38c) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x38c)
                        ;
                        *(uint *)(local_8d0.ray + 0x390) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x390)
                        ;
                        *(uint *)(local_8d0.ray + 0x394) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x394)
                        ;
                        *(uint *)(local_8d0.ray + 0x398) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x398)
                        ;
                        *(uint *)(local_8d0.ray + 0x39c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x39c)
                        ;
                        *(uint *)(local_8d0.ray + 0x3a0) =
                             (uint)(bVar89 & 1) * iVar72 |
                             (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 0x3a0);
                        *(uint *)(local_8d0.ray + 0x3a4) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x3a4)
                        ;
                        *(uint *)(local_8d0.ray + 0x3a8) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 0x3a8)
                        ;
                        *(uint *)(local_8d0.ray + 0x3ac) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x3ac)
                        ;
                        *(uint *)(local_8d0.ray + 0x3b0) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x3b0)
                        ;
                        *(uint *)(local_8d0.ray + 0x3b4) =
                             (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x3b4)
                        ;
                        *(uint *)(local_8d0.ray + 0x3b8) =
                             (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x3b8)
                        ;
                        *(uint *)(local_8d0.ray + 0x3bc) =
                             (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_8d0.hit + 0xc4);
                        iVar2 = *(int *)(local_8d0.hit + 200);
                        iVar67 = *(int *)(local_8d0.hit + 0xcc);
                        iVar68 = *(int *)(local_8d0.hit + 0xd0);
                        iVar69 = *(int *)(local_8d0.hit + 0xd4);
                        iVar70 = *(int *)(local_8d0.hit + 0xd8);
                        iVar71 = *(int *)(local_8d0.hit + 0xdc);
                        iVar72 = *(int *)(local_8d0.hit + 0xe0);
                        iVar73 = *(int *)(local_8d0.hit + 0xe4);
                        iVar74 = *(int *)(local_8d0.hit + 0xe8);
                        iVar75 = *(int *)(local_8d0.hit + 0xec);
                        iVar76 = *(int *)(local_8d0.hit + 0xf0);
                        iVar77 = *(int *)(local_8d0.hit + 0xf4);
                        iVar78 = *(int *)(local_8d0.hit + 0xf8);
                        iVar79 = *(int *)(local_8d0.hit + 0xfc);
                        bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                        bVar26 = SUB81(uVar94 >> 0xf,0);
                        *(uint *)(local_8d0.ray + 0x3c0) =
                             (uint)(bVar90 & 1) * *(int *)(local_8d0.hit + 0xc0) |
                             (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x3c0);
                        *(uint *)(local_8d0.ray + 0x3c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x3c4);
                        *(uint *)(local_8d0.ray + 0x3c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x3c8);
                        *(uint *)(local_8d0.ray + 0x3cc) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x3cc)
                        ;
                        *(uint *)(local_8d0.ray + 0x3d0) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x3d0)
                        ;
                        *(uint *)(local_8d0.ray + 0x3d4) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x3d4)
                        ;
                        *(uint *)(local_8d0.ray + 0x3d8) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x3d8)
                        ;
                        *(uint *)(local_8d0.ray + 0x3dc) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x3dc)
                        ;
                        *(uint *)(local_8d0.ray + 0x3e0) =
                             (uint)(bVar89 & 1) * iVar72 |
                             (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 0x3e0);
                        *(uint *)(local_8d0.ray + 0x3e4) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x3e4)
                        ;
                        *(uint *)(local_8d0.ray + 1000) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 1000);
                        *(uint *)(local_8d0.ray + 0x3ec) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x3ec)
                        ;
                        *(uint *)(local_8d0.ray + 0x3f0) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x3f0)
                        ;
                        *(uint *)(local_8d0.ray + 0x3f4) =
                             (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x3f4)
                        ;
                        *(uint *)(local_8d0.ray + 0x3f8) =
                             (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x3f8)
                        ;
                        *(uint *)(local_8d0.ray + 0x3fc) =
                             (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_8d0.hit + 0x104);
                        iVar2 = *(int *)(local_8d0.hit + 0x108);
                        iVar67 = *(int *)(local_8d0.hit + 0x10c);
                        iVar68 = *(int *)(local_8d0.hit + 0x110);
                        iVar69 = *(int *)(local_8d0.hit + 0x114);
                        iVar70 = *(int *)(local_8d0.hit + 0x118);
                        iVar71 = *(int *)(local_8d0.hit + 0x11c);
                        iVar72 = *(int *)(local_8d0.hit + 0x120);
                        iVar73 = *(int *)(local_8d0.hit + 0x124);
                        iVar74 = *(int *)(local_8d0.hit + 0x128);
                        iVar75 = *(int *)(local_8d0.hit + 300);
                        iVar76 = *(int *)(local_8d0.hit + 0x130);
                        iVar77 = *(int *)(local_8d0.hit + 0x134);
                        iVar78 = *(int *)(local_8d0.hit + 0x138);
                        iVar79 = *(int *)(local_8d0.hit + 0x13c);
                        bVar13 = (bool)((byte)(uVar94 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar94 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar94 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar94 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar94 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar94 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar94 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar94 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar94 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar94 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar94 >> 0xe) & 1);
                        bVar26 = SUB81(uVar94 >> 0xf,0);
                        *(uint *)(local_8d0.ray + 0x400) =
                             (uint)(bVar90 & 1) * *(int *)(local_8d0.hit + 0x100) |
                             (uint)!(bool)(bVar90 & 1) * *(int *)(local_8d0.ray + 0x400);
                        *(uint *)(local_8d0.ray + 0x404) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x404);
                        *(uint *)(local_8d0.ray + 0x408) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x408);
                        *(uint *)(local_8d0.ray + 0x40c) =
                             (uint)bVar15 * iVar67 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x40c)
                        ;
                        *(uint *)(local_8d0.ray + 0x410) =
                             (uint)bVar16 * iVar68 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x410)
                        ;
                        *(uint *)(local_8d0.ray + 0x414) =
                             (uint)bVar17 * iVar69 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x414)
                        ;
                        *(uint *)(local_8d0.ray + 0x418) =
                             (uint)bVar18 * iVar70 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x418)
                        ;
                        *(uint *)(local_8d0.ray + 0x41c) =
                             (uint)bVar19 * iVar71 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x41c)
                        ;
                        *(uint *)(local_8d0.ray + 0x420) =
                             (uint)(bVar89 & 1) * iVar72 |
                             (uint)!(bool)(bVar89 & 1) * *(int *)(local_8d0.ray + 0x420);
                        *(uint *)(local_8d0.ray + 0x424) =
                             (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x424)
                        ;
                        *(uint *)(local_8d0.ray + 0x428) =
                             (uint)bVar21 * iVar74 | (uint)!bVar21 * *(int *)(local_8d0.ray + 0x428)
                        ;
                        *(uint *)(local_8d0.ray + 0x42c) =
                             (uint)bVar22 * iVar75 | (uint)!bVar22 * *(int *)(local_8d0.ray + 0x42c)
                        ;
                        *(uint *)(local_8d0.ray + 0x430) =
                             (uint)bVar23 * iVar76 | (uint)!bVar23 * *(int *)(local_8d0.ray + 0x430)
                        ;
                        *(uint *)(local_8d0.ray + 0x434) =
                             (uint)bVar24 * iVar77 | (uint)!bVar24 * *(int *)(local_8d0.ray + 0x434)
                        ;
                        *(uint *)(local_8d0.ray + 0x438) =
                             (uint)bVar25 * iVar78 | (uint)!bVar25 * *(int *)(local_8d0.ray + 0x438)
                        ;
                        *(uint *)(local_8d0.ray + 0x43c) =
                             (uint)bVar26 * iVar79 | (uint)!bVar26 * *(int *)(local_8d0.ray + 0x43c)
                        ;
                        auVar197 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_8d0.hit + 0x140));
                        auVar197 = vmovdqu32_avx512f(auVar197);
                        *(undefined1 (*) [64])(local_8d0.ray + 0x440) = auVar197;
                        auVar197 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_8d0.hit + 0x180));
                        auVar197 = vmovdqu32_avx512f(auVar197);
                        *(undefined1 (*) [64])(local_8d0.ray + 0x480) = auVar197;
                        auVar197 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_8d0.hit + 0x1c0));
                        auVar197 = vmovdqa32_avx512f(auVar197);
                        *(undefined1 (*) [64])(local_8d0.ray + 0x4c0) = auVar197;
                        auVar197 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_8d0.hit + 0x200));
                        auVar197 = vmovdqa32_avx512f(auVar197);
                        *(undefined1 (*) [64])(local_8d0.ray + 0x500) = auVar197;
                      }
                      bVar100 = ~(byte)(1 << ((uint)uVar91 & 0x1f)) & bVar100;
                      uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar42._4_4_ = uVar159;
                      auVar42._0_4_ = uVar159;
                      auVar42._8_4_ = uVar159;
                      auVar42._12_4_ = uVar159;
                      auVar42._16_4_ = uVar159;
                      auVar42._20_4_ = uVar159;
                      auVar42._24_4_ = uVar159;
                      auVar42._28_4_ = uVar159;
                      uVar175 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar42,2);
                      bVar90 = bVar100 & (byte)uVar175;
                      uVar95 = (uint)bVar90;
                      if ((bVar100 & (byte)uVar175) != 0) {
                        auVar172._8_4_ = 0x7f800000;
                        auVar172._0_8_ = 0x7f8000007f800000;
                        auVar172._12_4_ = 0x7f800000;
                        auVar172._16_4_ = 0x7f800000;
                        auVar172._20_4_ = 0x7f800000;
                        auVar172._24_4_ = 0x7f800000;
                        auVar172._28_4_ = 0x7f800000;
                        auVar127 = vblendmps_avx512vl(auVar172,in_ZMM21._0_32_);
                        auVar148._0_4_ =
                             (uint)(bVar90 & 1) * auVar127._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 1 & 1);
                        auVar148._4_4_ = (uint)bVar13 * auVar127._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 2 & 1);
                        auVar148._8_4_ = (uint)bVar13 * auVar127._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 3 & 1);
                        auVar148._12_4_ =
                             (uint)bVar13 * auVar127._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 4 & 1);
                        auVar148._16_4_ =
                             (uint)bVar13 * auVar127._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 5 & 1);
                        auVar148._20_4_ =
                             (uint)bVar13 * auVar127._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 6 & 1);
                        auVar148._24_4_ =
                             (uint)bVar13 * auVar127._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar148._28_4_ =
                             (uint)(bVar90 >> 7) * auVar127._28_4_ |
                             (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                        auVar127 = vshufps_avx(auVar148,auVar148,0xb1);
                        auVar127 = vminps_avx(auVar148,auVar127);
                        auVar128 = vshufpd_avx(auVar127,auVar127,5);
                        auVar127 = vminps_avx(auVar127,auVar128);
                        auVar128 = vpermpd_avx2(auVar127,0x4e);
                        auVar127 = vminps_avx(auVar127,auVar128);
                        uVar175 = vcmpps_avx512vl(auVar148,auVar127,0);
                        bVar100 = (byte)uVar175 & bVar90;
                        uVar93 = uVar95;
                        if (bVar100 != 0) {
                          uVar93 = (uint)bVar100;
                        }
                        uVar92 = 0;
                        for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                          uVar92 = uVar92 + 1;
                        }
                        uVar91 = (ulong)uVar92;
                      }
                    } while (bVar90 != 0);
                  }
                }
              }
            }
          }
          auVar219 = ZEXT3264(auVar195);
          auVar197 = ZEXT3264(auVar136);
          lVar98 = lVar98 + 8;
        } while ((int)lVar98 < iVar10);
      }
      uVar159 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar34._4_4_ = uVar159;
      auVar34._0_4_ = uVar159;
      auVar34._8_4_ = uVar159;
      auVar34._12_4_ = uVar159;
      uVar31 = vcmpps_avx512vl(local_530,auVar34,2);
      uVar97 = (uint)uVar99 & (uint)uVar31;
      uVar99 = (ulong)uVar97;
    } while (uVar97 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }